

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  _func_int *p_Var9;
  size_t sVar10;
  void *pvVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int *piVar76;
  void *pvVar77;
  int iVar78;
  uint uVar79;
  undefined1 (*pauVar80) [32];
  undefined1 (*pauVar81) [16];
  long lVar82;
  float *pfVar83;
  long lVar84;
  uint _w;
  int iVar85;
  int iVar86;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  ulong uVar87;
  undefined1 (*pauVar88) [32];
  float *pfVar89;
  long lVar90;
  undefined1 (*pauVar91) [32];
  ulong uVar92;
  undefined1 (*pauVar93) [16];
  undefined4 *puVar94;
  uint *puVar95;
  undefined1 (*pauVar96) [32];
  float *pfVar97;
  float *pfVar98;
  int iVar99;
  uint *puVar100;
  undefined4 *puVar101;
  int iVar102;
  float *pfVar103;
  ulong uVar104;
  int iVar105;
  long lVar106;
  undefined1 (*pauVar107) [32];
  undefined1 (*pauVar108) [16];
  bool bVar109;
  bool bVar110;
  bool bVar111;
  bool bVar112;
  bool bVar113;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  v4sf one;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  ulong local_160;
  ulong local_158;
  ulong local_138;
  Mat local_e8;
  long local_a0;
  void *local_98;
  void *local_90;
  long local_88;
  ulong local_80;
  Mat local_78;
  undefined1 auVar170 [32];
  undefined1 auVar142 [16];
  undefined1 auVar180 [32];
  
  iVar4 = bottom_blob->elempack;
  if ((long)iVar4 == 0x10) {
    local_e8.cstep = 0;
    local_e8.data = (void *)0x0;
    local_e8.refcount._0_4_ = 0;
    local_e8.refcount._4_4_ = 0;
    local_e8.elemsize._0_4_ = 0;
    local_e8.elemsize._4_4_ = 0;
    local_e8.elempack = 0;
    local_e8.allocator = (Allocator *)0x0;
    local_e8.dims = 0;
    local_e8.w = 0;
    local_e8.h = 0;
    local_e8.d = 0;
    local_e8.c = 0;
    convert_packing(bottom_blob,&local_e8,8,opt);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    (*this->_vptr_Convolution1D_x86_avx512[2])(this,&local_e8,&local_78,opt);
    convert_packing(&local_78,top_blob,0x10,opt);
    piVar76 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar76 != (int *)0x0) {
      LOCK();
      *piVar76 = *piVar76 + -1;
      UNLOCK();
      if (*piVar76 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar76 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar76 != (int *)0x0) {
      LOCK();
      *piVar76 = *piVar76 + -1;
      UNLOCK();
      if (*piVar76 == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          if (local_e8.data != (void *)0x0) {
            free(local_e8.data);
          }
        }
        else {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar86 = 0;
  }
  else {
    uVar87 = bottom_blob->elemsize;
    p_Var6 = this->_vptr_Convolution1D_x86_avx512[-3];
    iVar5 = *(int *)(&this->field_0xd4 + (long)p_Var6);
    iVar105 = *(int *)(&this->field_0xd8 + (long)p_Var6);
    local_e8.cstep = 0;
    local_e8.data = (void *)0x0;
    local_e8.refcount._0_4_ = 0;
    local_e8.refcount._4_4_ = 0;
    local_e8.elemsize._0_4_ = 0;
    local_e8.elemsize._4_4_ = 0;
    local_e8.elempack = 0;
    local_e8.allocator = (Allocator *)0x0;
    local_e8.dims = 0;
    local_e8.d = 0;
    local_e8.c = 0;
    local_e8.w = local_e8.refcount._4_4_;
    local_e8.h = (uint)local_e8.elemsize;
    Convolution1D::make_padding
              ((Convolution1D *)
               ((long)&this->_vptr_Convolution1D_x86_avx512 +
               (long)this->_vptr_Convolution1D_x86_avx512[-3]),bottom_blob,&local_e8,opt);
    iVar78 = local_e8.h;
    iVar86 = -100;
    if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
      uVar79 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]);
      lVar90 = 1;
      if (opt->use_packing_layout == true) {
        lVar90 = 8;
        if ((uVar79 & 7) != 0) {
          lVar90 = (ulong)((uVar79 & 3) == 0) * 3 + 1;
        }
      }
      uVar104 = (ulong)(uint)local_e8.h;
      iVar99 = (int)lVar90;
      iVar5 = (local_e8.w + ~((iVar5 + -1) * iVar105)) /
              *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx512[-3]);
      _w = iVar5 + 1;
      uVar79 = (int)uVar79 / iVar99;
      Mat::create(top_blob,_w,uVar79,lVar90 * (uVar87 / (ulong)(long)iVar4),iVar99,
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        bVar109 = iVar99 == 8;
        bVar111 = 0 < (int)uVar79;
        if (iVar4 == 8 && (bVar111 && bVar109)) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_160 = 0;
          auVar177._8_4_ = 0x42b0c0a5;
          auVar177._0_8_ = 0x42b0c0a542b0c0a5;
          auVar177._12_4_ = 0x42b0c0a5;
          auVar177._16_4_ = 0x42b0c0a5;
          auVar177._20_4_ = 0x42b0c0a5;
          auVar177._24_4_ = 0x42b0c0a5;
          auVar177._28_4_ = 0x42b0c0a5;
          auVar178._8_4_ = 0xc2b0c0a5;
          auVar178._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar178._12_4_ = 0xc2b0c0a5;
          auVar178._16_4_ = 0xc2b0c0a5;
          auVar178._20_4_ = 0xc2b0c0a5;
          auVar178._24_4_ = 0xc2b0c0a5;
          auVar178._28_4_ = 0xc2b0c0a5;
          auVar187._8_4_ = 0x3f000000;
          auVar187._0_8_ = 0x3f0000003f000000;
          auVar187._12_4_ = 0x3f000000;
          auVar187._16_4_ = 0x3f000000;
          auVar187._20_4_ = 0x3f000000;
          auVar187._24_4_ = 0x3f000000;
          auVar187._28_4_ = 0x3f000000;
          auVar188._8_4_ = 0x3fb8aa3b;
          auVar188._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar188._12_4_ = 0x3fb8aa3b;
          auVar188._16_4_ = 0x3fb8aa3b;
          auVar188._20_4_ = 0x3fb8aa3b;
          auVar188._24_4_ = 0x3fb8aa3b;
          auVar188._28_4_ = 0x3fb8aa3b;
          auVar179._8_4_ = 0x3f800000;
          auVar179._0_8_ = 0x3f8000003f800000;
          auVar179._12_4_ = 0x3f800000;
          auVar179._16_4_ = 0x3f800000;
          auVar179._20_4_ = 0x3f800000;
          auVar179._24_4_ = 0x3f800000;
          auVar179._28_4_ = 0x3f800000;
          auVar180._8_4_ = 0x3f318000;
          auVar180._0_8_ = 0x3f3180003f318000;
          auVar180._12_4_ = 0x3f318000;
          auVar180._16_4_ = 0x3f318000;
          auVar180._20_4_ = 0x3f318000;
          auVar180._24_4_ = 0x3f318000;
          auVar180._28_4_ = 0x3f318000;
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar269._8_4_ = 0x3ab743ce;
          auVar269._0_8_ = 0x3ab743ce3ab743ce;
          auVar269._12_4_ = 0x3ab743ce;
          auVar269._16_4_ = 0x3ab743ce;
          auVar269._20_4_ = 0x3ab743ce;
          auVar269._24_4_ = 0x3ab743ce;
          auVar269._28_4_ = 0x3ab743ce;
          auVar274._8_4_ = 0x3c088908;
          auVar274._0_8_ = 0x3c0889083c088908;
          auVar274._12_4_ = 0x3c088908;
          auVar274._16_4_ = 0x3c088908;
          auVar274._20_4_ = 0x3c088908;
          auVar274._24_4_ = 0x3c088908;
          auVar274._28_4_ = 0x3c088908;
          auVar280._8_4_ = 0x3d2aa9c1;
          auVar280._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar280._12_4_ = 0x3d2aa9c1;
          auVar280._16_4_ = 0x3d2aa9c1;
          auVar280._20_4_ = 0x3d2aa9c1;
          auVar280._24_4_ = 0x3d2aa9c1;
          auVar280._28_4_ = 0x3d2aa9c1;
          auVar286._8_4_ = 0x3e2aaaaa;
          auVar286._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar286._12_4_ = 0x3e2aaaaa;
          auVar286._16_4_ = 0x3e2aaaaa;
          auVar286._20_4_ = 0x3e2aaaaa;
          auVar286._24_4_ = 0x3e2aaaaa;
          auVar286._28_4_ = 0x3e2aaaaa;
          auVar292._8_4_ = 0x3f800000;
          auVar292._0_8_ = 0x3f8000003f800000;
          auVar292._12_4_ = 0x3f800000;
          auVar292._16_4_ = 0x3f800000;
          auVar292._20_4_ = 0x3f800000;
          auVar292._24_4_ = 0x3f800000;
          auVar292._28_4_ = 0x3f800000;
          auVar298._8_4_ = 0xb95e8083;
          auVar298._0_8_ = 0xb95e8083b95e8083;
          auVar298._12_4_ = 0xb95e8083;
          auVar298._16_4_ = 0xb95e8083;
          auVar298._20_4_ = 0xb95e8083;
          auVar298._24_4_ = 0xb95e8083;
          auVar298._28_4_ = 0xb95e8083;
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar160 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar163 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar164 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          do {
            if (-1 < iVar5) {
              pauVar91 = (undefined1 (*) [32])
                         ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar86 = 0;
              iVar105 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar200 = ZEXT3264(*(undefined1 (*) [32])
                                       (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                       local_160 * 0x20));
                }
                if (0 < iVar78) {
                  pauVar107 = (undefined1 (*) [32])
                              ((this->weight_data_packed).cstep * local_160 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var9 = pp_Var8[-3];
                  iVar85 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  puVar101 = (undefined4 *)
                             ((long)local_e8.data +
                             (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar86) * 4 + 0x1c)
                  ;
                  uVar87 = 0;
                  do {
                    if (0 < iVar85) {
                      puVar94 = puVar101;
                      pauVar80 = pauVar107;
                      iVar102 = iVar85;
                      do {
                        uVar1 = puVar94[-7];
                        auVar167._4_4_ = uVar1;
                        auVar167._0_4_ = uVar1;
                        auVar167._8_4_ = uVar1;
                        auVar167._12_4_ = uVar1;
                        auVar167._16_4_ = uVar1;
                        auVar167._20_4_ = uVar1;
                        auVar167._24_4_ = uVar1;
                        auVar167._28_4_ = uVar1;
                        auVar167 = vfmadd132ps_avx512vl(*pauVar80,auVar200._0_32_,auVar167);
                        uVar1 = puVar94[-6];
                        auVar171._4_4_ = uVar1;
                        auVar171._0_4_ = uVar1;
                        auVar171._8_4_ = uVar1;
                        auVar171._12_4_ = uVar1;
                        auVar171._16_4_ = uVar1;
                        auVar171._20_4_ = uVar1;
                        auVar171._24_4_ = uVar1;
                        auVar171._28_4_ = uVar1;
                        auVar167 = vfmadd231ps_avx512vl(auVar167,pauVar80[1],auVar171);
                        uVar1 = puVar94[-5];
                        auVar168._4_4_ = uVar1;
                        auVar168._0_4_ = uVar1;
                        auVar168._8_4_ = uVar1;
                        auVar168._12_4_ = uVar1;
                        auVar168._16_4_ = uVar1;
                        auVar168._20_4_ = uVar1;
                        auVar168._24_4_ = uVar1;
                        auVar168._28_4_ = uVar1;
                        auVar167 = vfmadd231ps_avx512vl(auVar167,pauVar80[2],auVar168);
                        uVar1 = puVar94[-4];
                        auVar169._4_4_ = uVar1;
                        auVar169._0_4_ = uVar1;
                        auVar169._8_4_ = uVar1;
                        auVar169._12_4_ = uVar1;
                        auVar169._16_4_ = uVar1;
                        auVar169._20_4_ = uVar1;
                        auVar169._24_4_ = uVar1;
                        auVar169._28_4_ = uVar1;
                        auVar167 = vfmadd231ps_avx512vl(auVar167,pauVar80[3],auVar169);
                        uVar1 = puVar94[-3];
                        auVar43._4_4_ = uVar1;
                        auVar43._0_4_ = uVar1;
                        auVar43._8_4_ = uVar1;
                        auVar43._12_4_ = uVar1;
                        auVar43._16_4_ = uVar1;
                        auVar43._20_4_ = uVar1;
                        auVar43._24_4_ = uVar1;
                        auVar43._28_4_ = uVar1;
                        auVar167 = vfmadd231ps_avx512vl(auVar167,pauVar80[4],auVar43);
                        uVar1 = puVar94[-2];
                        auVar44._4_4_ = uVar1;
                        auVar44._0_4_ = uVar1;
                        auVar44._8_4_ = uVar1;
                        auVar44._12_4_ = uVar1;
                        auVar44._16_4_ = uVar1;
                        auVar44._20_4_ = uVar1;
                        auVar44._24_4_ = uVar1;
                        auVar44._28_4_ = uVar1;
                        auVar167 = vfmadd231ps_avx512vl(auVar167,pauVar80[5],auVar44);
                        uVar1 = puVar94[-1];
                        auVar45._4_4_ = uVar1;
                        auVar45._0_4_ = uVar1;
                        auVar45._8_4_ = uVar1;
                        auVar45._12_4_ = uVar1;
                        auVar45._16_4_ = uVar1;
                        auVar45._20_4_ = uVar1;
                        auVar45._24_4_ = uVar1;
                        auVar45._28_4_ = uVar1;
                        auVar167 = vfmadd231ps_avx512vl(auVar167,pauVar80[6],auVar45);
                        uVar1 = *puVar94;
                        auVar46._4_4_ = uVar1;
                        auVar46._0_4_ = uVar1;
                        auVar46._8_4_ = uVar1;
                        auVar46._12_4_ = uVar1;
                        auVar46._16_4_ = uVar1;
                        auVar46._20_4_ = uVar1;
                        auVar46._24_4_ = uVar1;
                        auVar46._28_4_ = uVar1;
                        auVar167 = vfmadd231ps_avx512vl(auVar167,pauVar80[7],auVar46);
                        auVar200 = ZEXT3264(auVar167);
                        pauVar80 = pauVar80 + 8;
                        puVar94 = puVar94 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 3);
                        iVar102 = iVar102 + -1;
                      } while (iVar102 != 0);
                      pauVar107 = pauVar107 + (ulong)(iVar85 - 1) * 8 + 8;
                    }
                    uVar87 = uVar87 + 1;
                    puVar101 = (undefined4 *)
                               ((long)puVar101 +
                               (long)local_e8.w *
                               CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize));
                  } while (uVar87 != uVar104);
                }
                auVar167 = auVar200._0_32_;
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  auVar171 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar201._28_36_ = auVar200._28_36_;
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar167 = vmaxps_avx(auVar167,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar168 = vmaxps_avx(auVar167,auVar171);
                    auVar167 = vminps_avx(auVar167,auVar171);
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar57._4_4_ = uVar1;
                    auVar57._0_4_ = uVar1;
                    auVar57._8_4_ = uVar1;
                    auVar57._12_4_ = uVar1;
                    auVar57._16_4_ = uVar1;
                    auVar57._20_4_ = uVar1;
                    auVar57._24_4_ = uVar1;
                    auVar57._28_4_ = uVar1;
                    auVar167 = vfmadd132ps_avx512vl(auVar167,auVar168,auVar57);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar55._4_4_ = uVar1;
                    auVar55._0_4_ = uVar1;
                    auVar55._8_4_ = uVar1;
                    auVar55._12_4_ = uVar1;
                    auVar55._16_4_ = uVar1;
                    auVar55._20_4_ = uVar1;
                    auVar55._24_4_ = uVar1;
                    auVar55._28_4_ = uVar1;
                    auVar167 = vmaxps_avx512vl(auVar167,auVar55);
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar56._4_4_ = uVar1;
                    auVar56._0_4_ = uVar1;
                    auVar56._8_4_ = uVar1;
                    auVar56._12_4_ = uVar1;
                    auVar56._16_4_ = uVar1;
                    auVar56._20_4_ = uVar1;
                    auVar56._24_4_ = uVar1;
                    auVar56._28_4_ = uVar1;
                    auVar167 = vminps_avx512vl(auVar167,auVar56);
                    break;
                  case 4:
                    auVar53._8_4_ = 0x80000000;
                    auVar53._0_8_ = 0x8000000080000000;
                    auVar53._12_4_ = 0x80000000;
                    auVar53._16_4_ = 0x80000000;
                    auVar53._20_4_ = 0x80000000;
                    auVar53._24_4_ = 0x80000000;
                    auVar53._28_4_ = 0x80000000;
                    auVar167 = vxorps_avx512vl(auVar167,auVar53);
                    auVar167 = vminps_avx(auVar167,auVar177);
                    auVar167 = vmaxps_avx(auVar167,auVar178);
                    auVar114 = vfmadd231ps_fma(auVar187,auVar167,auVar188);
                    auVar171 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar171,1);
                    auVar168 = vsubps_avx512vl(auVar171,auVar179);
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar176._0_4_ =
                         (uint)bVar110 * auVar168._0_4_ | (uint)!bVar110 * auVar171._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar176._4_4_ =
                         (uint)bVar110 * auVar168._4_4_ | (uint)!bVar110 * auVar171._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar176._8_4_ =
                         (uint)bVar110 * auVar168._8_4_ | (uint)!bVar110 * auVar171._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar176._12_4_ =
                         (uint)bVar110 * auVar168._12_4_ | (uint)!bVar110 * auVar171._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar176._16_4_ =
                         (uint)bVar110 * auVar168._16_4_ | (uint)!bVar110 * auVar171._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar176._20_4_ =
                         (uint)bVar110 * auVar168._20_4_ | (uint)!bVar110 * auVar171._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar176._24_4_ =
                         (uint)bVar110 * auVar168._24_4_ | (uint)!bVar110 * auVar171._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar176._28_4_ =
                         (uint)bVar110 * auVar168._28_4_ | (uint)!bVar110 * auVar171._28_4_;
                    auVar167 = vfmsub231ps_avx512vl(auVar167,auVar176,auVar180);
                    auVar54._8_4_ = 0x395e8083;
                    auVar54._0_8_ = 0x395e8083395e8083;
                    auVar54._12_4_ = 0x395e8083;
                    auVar54._16_4_ = 0x395e8083;
                    auVar54._20_4_ = 0x395e8083;
                    auVar54._24_4_ = 0x395e8083;
                    auVar54._28_4_ = 0x395e8083;
                    auVar167 = vfmsub231ps_avx512vl(auVar167,auVar176,auVar54);
                    auVar241._0_4_ = auVar167._0_4_ * auVar167._0_4_;
                    auVar241._4_4_ = auVar167._4_4_ * auVar167._4_4_;
                    auVar241._8_4_ = auVar167._8_4_ * auVar167._8_4_;
                    auVar241._12_4_ = auVar167._12_4_ * auVar167._12_4_;
                    auVar241._16_4_ = auVar167._16_4_ * auVar167._16_4_;
                    auVar241._20_4_ = auVar167._20_4_ * auVar167._20_4_;
                    auVar241._24_4_ = auVar167._24_4_ * auVar167._24_4_;
                    auVar241._28_4_ = 0;
                    auVar114 = vfmadd213ps_fma(auVar156,auVar167,auVar269);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar167,auVar274);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar167,auVar280);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar167,auVar286);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar167,auVar187);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar241,auVar167);
                    auVar242._0_4_ = auVar114._0_4_ + 1.0;
                    auVar242._4_4_ = auVar114._4_4_ + 1.0;
                    auVar242._8_4_ = auVar114._8_4_ + 1.0;
                    auVar242._12_4_ = auVar114._12_4_ + 1.0;
                    auVar242._16_4_ = 0x3f800000;
                    auVar242._20_4_ = 0x3f800000;
                    auVar242._24_4_ = 0x3f800000;
                    auVar242._28_4_ = 0x3f800000;
                    auVar167 = vcvttps2dq_avx512vl(auVar176);
                    auVar167 = vpslld_avx2(auVar167,0x17);
                    auVar167 = vpaddd_avx2(auVar292,auVar167);
                    auVar114 = vfmadd213ps_fma(auVar167,auVar242,auVar179);
                    auVar167 = vrcpps_avx(ZEXT1632(auVar114));
                    auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar167,auVar179);
                    auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar167,auVar167);
                    auVar167 = ZEXT1632(auVar114);
                    break;
                  case 5:
                    auVar167 = vminps_avx(auVar167,auVar177);
                    auVar167 = vmaxps_avx(auVar167,auVar178);
                    auVar114 = vfmadd213ps_fma(auVar188,auVar167,auVar187);
                    auVar168 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar168,1);
                    auVar169 = vsubps_avx512vl(auVar168,auVar179);
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar170._0_4_ =
                         (uint)bVar110 * auVar169._0_4_ | (uint)!bVar110 * auVar168._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar170._4_4_ =
                         (uint)bVar110 * auVar169._4_4_ | (uint)!bVar110 * auVar168._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar170._8_4_ =
                         (uint)bVar110 * auVar169._8_4_ | (uint)!bVar110 * auVar168._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar170._12_4_ =
                         (uint)bVar110 * auVar169._12_4_ | (uint)!bVar110 * auVar168._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar170._16_4_ =
                         (uint)bVar110 * auVar169._16_4_ | (uint)!bVar110 * auVar168._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar170._20_4_ =
                         (uint)bVar110 * auVar169._20_4_ | (uint)!bVar110 * auVar168._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar170._24_4_ =
                         (uint)bVar110 * auVar169._24_4_ | (uint)!bVar110 * auVar168._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar170._28_4_ =
                         (uint)bVar110 * auVar169._28_4_ | (uint)!bVar110 * auVar168._28_4_;
                    auVar167 = vfmsub231ps_avx512vl(auVar167,auVar170,auVar180);
                    auVar167 = vfnmsub231ps_avx512vl(auVar167,auVar170,auVar298);
                    auVar260._0_4_ = auVar167._0_4_ * auVar167._0_4_;
                    auVar260._4_4_ = auVar167._4_4_ * auVar167._4_4_;
                    auVar260._8_4_ = auVar167._8_4_ * auVar167._8_4_;
                    auVar260._12_4_ = auVar167._12_4_ * auVar167._12_4_;
                    auVar260._16_4_ = auVar167._16_4_ * auVar167._16_4_;
                    auVar260._20_4_ = auVar167._20_4_ * auVar167._20_4_;
                    auVar260._24_4_ = auVar167._24_4_ * auVar167._24_4_;
                    auVar260._28_4_ = 0;
                    auVar168 = vfmadd213ps_avx512vl(auVar156,auVar167,auVar269);
                    auVar168 = vfmadd213ps_avx512vl(auVar168,auVar167,auVar274);
                    auVar168 = vfmadd213ps_avx512vl(auVar168,auVar167,auVar280);
                    auVar168 = vfmadd213ps_avx512vl(auVar168,auVar167,auVar286);
                    auVar168 = vfmadd213ps_avx512vl(auVar168,auVar167,auVar187);
                    auVar167 = vfmadd213ps_avx512vl(auVar168,auVar260,auVar167);
                    auVar168 = vaddps_avx512vl(auVar167,auVar179);
                    auVar167 = vcvttps2dq_avx512vl(auVar170);
                    auVar167 = vpslld_avx2(auVar167,0x17);
                    auVar167 = vpaddd_avx2(auVar167,auVar292);
                    auVar114 = vfmadd213ps_fma(auVar167,auVar168,auVar179);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar171,2);
                    auVar48._8_4_ = 0x800000;
                    auVar48._0_8_ = 0x80000000800000;
                    auVar48._12_4_ = 0x800000;
                    auVar48._16_4_ = 0x800000;
                    auVar48._20_4_ = 0x800000;
                    auVar48._24_4_ = 0x800000;
                    auVar48._28_4_ = 0x800000;
                    auVar167 = vmaxps_avx512vl(ZEXT1632(auVar114),auVar48);
                    auVar169 = vpsrld_avx2(auVar167,0x17);
                    auVar171 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar49._8_4_ = 0x3f000000;
                    auVar49._0_8_ = 0x3f0000003f000000;
                    auVar49._12_4_ = 0x3f000000;
                    auVar49._16_4_ = 0x3f000000;
                    auVar49._20_4_ = 0x3f000000;
                    auVar49._24_4_ = 0x3f000000;
                    auVar49._28_4_ = 0x3f000000;
                    auVar167 = vpternlogd_avx512vl(auVar167,auVar171,auVar49,0xea);
                    auVar50._8_4_ = 0x3f3504f3;
                    auVar50._0_8_ = 0x3f3504f33f3504f3;
                    auVar50._12_4_ = 0x3f3504f3;
                    auVar50._16_4_ = 0x3f3504f3;
                    auVar50._20_4_ = 0x3f3504f3;
                    auVar50._24_4_ = 0x3f3504f3;
                    auVar50._28_4_ = 0x3f3504f3;
                    uVar92 = vcmpps_avx512vl(auVar167,auVar50,1);
                    auVar171 = vaddps_avx512vl(auVar167,auVar157);
                    auVar167 = vaddps_avx512vl(auVar171,auVar167);
                    bVar110 = (bool)((byte)uVar92 & 1);
                    auVar172._0_4_ =
                         (uint)bVar110 * auVar167._0_4_ | (uint)!bVar110 * auVar171._0_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar172._4_4_ =
                         (uint)bVar110 * auVar167._4_4_ | (uint)!bVar110 * auVar171._4_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar172._8_4_ =
                         (uint)bVar110 * auVar167._8_4_ | (uint)!bVar110 * auVar171._8_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar172._12_4_ =
                         (uint)bVar110 * auVar167._12_4_ | (uint)!bVar110 * auVar171._12_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar172._16_4_ =
                         (uint)bVar110 * auVar167._16_4_ | (uint)!bVar110 * auVar171._16_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar172._20_4_ =
                         (uint)bVar110 * auVar167._20_4_ | (uint)!bVar110 * auVar171._20_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar172._24_4_ =
                         (uint)bVar110 * auVar167._24_4_ | (uint)!bVar110 * auVar171._24_4_;
                    bVar110 = SUB81(uVar92 >> 7,0);
                    auVar172._28_4_ =
                         (uint)bVar110 * auVar167._28_4_ | (uint)!bVar110 * auVar171._28_4_;
                    auVar171 = vmulps_avx512vl(auVar172,auVar172);
                    auVar51._8_4_ = 0xbdebd1b8;
                    auVar51._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar51._12_4_ = 0xbdebd1b8;
                    auVar51._16_4_ = 0xbdebd1b8;
                    auVar51._20_4_ = 0xbdebd1b8;
                    auVar51._24_4_ = 0xbdebd1b8;
                    auVar51._28_4_ = 0xbdebd1b8;
                    auVar167 = vfmadd213ps_avx512vl(auVar158,auVar172,auVar51);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar172,auVar159);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar172,auVar160);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar172,auVar161);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar172,auVar162);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar172,auVar163);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar172,auVar164);
                    auVar167 = vfmadd213ps_avx512vl(auVar167,auVar172,auVar165);
                    auVar168 = vmulps_avx512vl(auVar171,auVar172);
                    auVar168 = vmulps_avx512vl(auVar168,auVar167);
                    auVar52._8_4_ = 0xffffff82;
                    auVar52._0_8_ = 0xffffff82ffffff82;
                    auVar52._12_4_ = 0xffffff82;
                    auVar52._16_4_ = 0xffffff82;
                    auVar52._20_4_ = 0xffffff82;
                    auVar52._24_4_ = 0xffffff82;
                    auVar52._28_4_ = 0xffffff82;
                    auVar167 = vpaddd_avx512vl(auVar169,auVar52);
                    auVar167 = vcvtdq2ps_avx(auVar167);
                    auVar169 = vsubps_avx512vl(auVar167,auVar179);
                    bVar110 = (bool)((byte)uVar92 & 1);
                    auVar173._0_4_ =
                         (uint)bVar110 * auVar169._0_4_ | (uint)!bVar110 * auVar167._0_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar173._4_4_ =
                         (uint)bVar110 * auVar169._4_4_ | (uint)!bVar110 * auVar167._4_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar173._8_4_ =
                         (uint)bVar110 * auVar169._8_4_ | (uint)!bVar110 * auVar167._8_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar173._12_4_ =
                         (uint)bVar110 * auVar169._12_4_ | (uint)!bVar110 * auVar167._12_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar173._16_4_ =
                         (uint)bVar110 * auVar169._16_4_ | (uint)!bVar110 * auVar167._16_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar173._20_4_ =
                         (uint)bVar110 * auVar169._20_4_ | (uint)!bVar110 * auVar167._20_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar173._24_4_ =
                         (uint)bVar110 * auVar169._24_4_ | (uint)!bVar110 * auVar167._24_4_;
                    bVar110 = SUB81(uVar92 >> 7,0);
                    auVar173._28_4_ =
                         (uint)bVar110 * auVar169._28_4_ | (uint)!bVar110 * auVar167._28_4_;
                    auVar167 = vfmadd231ps_avx512vl(auVar168,auVar173,auVar298);
                    auVar167 = vfmsub231ps_avx512vl(auVar167,auVar187,auVar171);
                    auVar167 = vsubps_avx512vl(auVar167,auVar172);
                    auVar114 = vfmsub231ps_fma(auVar167,auVar180,auVar173);
                    auVar167 = vmulps_avx512vl(ZEXT1632(auVar114),auVar166);
                    auVar171 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar174._0_4_ =
                         (uint)bVar110 * auVar171._0_4_ | (uint)!bVar110 * auVar167._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar174._4_4_ =
                         (uint)bVar110 * auVar171._4_4_ | (uint)!bVar110 * auVar167._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar174._8_4_ =
                         (uint)bVar110 * auVar171._8_4_ | (uint)!bVar110 * auVar167._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar174._12_4_ =
                         (uint)bVar110 * auVar171._12_4_ | (uint)!bVar110 * auVar167._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar174._16_4_ =
                         (uint)bVar110 * auVar171._16_4_ | (uint)!bVar110 * auVar167._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar174._20_4_ =
                         (uint)bVar110 * auVar171._20_4_ | (uint)!bVar110 * auVar167._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar174._24_4_ =
                         (uint)bVar110 * auVar171._24_4_ | (uint)!bVar110 * auVar167._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar174._28_4_ =
                         (uint)bVar110 * auVar171._28_4_ | (uint)!bVar110 * auVar167._28_4_;
                    auVar167 = vminps_avx(auVar174,auVar177);
                    auVar167 = vmaxps_avx(auVar167,auVar178);
                    auVar114 = vfmadd213ps_fma(auVar188,auVar167,auVar187);
                    auVar171 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar171,1);
                    auVar168 = vsubps_avx512vl(auVar171,auVar179);
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar175._0_4_ =
                         (uint)bVar110 * auVar168._0_4_ | (uint)!bVar110 * auVar171._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar175._4_4_ =
                         (uint)bVar110 * auVar168._4_4_ | (uint)!bVar110 * auVar171._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar175._8_4_ =
                         (uint)bVar110 * auVar168._8_4_ | (uint)!bVar110 * auVar171._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar175._12_4_ =
                         (uint)bVar110 * auVar168._12_4_ | (uint)!bVar110 * auVar171._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar175._16_4_ =
                         (uint)bVar110 * auVar168._16_4_ | (uint)!bVar110 * auVar171._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar175._20_4_ =
                         (uint)bVar110 * auVar168._20_4_ | (uint)!bVar110 * auVar171._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar175._24_4_ =
                         (uint)bVar110 * auVar168._24_4_ | (uint)!bVar110 * auVar171._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar175._28_4_ =
                         (uint)bVar110 * auVar168._28_4_ | (uint)!bVar110 * auVar171._28_4_;
                    auVar167 = vfmsub231ps_avx512vl(auVar167,auVar175,auVar180);
                    auVar167 = vfnmsub231ps_avx512vl(auVar167,auVar175,auVar298);
                    auVar261._0_4_ = auVar167._0_4_ * auVar167._0_4_;
                    auVar261._4_4_ = auVar167._4_4_ * auVar167._4_4_;
                    auVar261._8_4_ = auVar167._8_4_ * auVar167._8_4_;
                    auVar261._12_4_ = auVar167._12_4_ * auVar167._12_4_;
                    auVar261._16_4_ = auVar167._16_4_ * auVar167._16_4_;
                    auVar261._20_4_ = auVar167._20_4_ * auVar167._20_4_;
                    auVar261._24_4_ = auVar167._24_4_ * auVar167._24_4_;
                    auVar261._28_4_ = 0;
                    auVar171 = vfmadd213ps_avx512vl(auVar156,auVar167,auVar269);
                    auVar171 = vfmadd213ps_avx512vl(auVar171,auVar167,auVar274);
                    auVar171 = vfmadd213ps_avx512vl(auVar171,auVar167,auVar280);
                    auVar171 = vfmadd213ps_avx512vl(auVar171,auVar167,auVar286);
                    auVar171 = vfmadd213ps_avx512vl(auVar171,auVar167,auVar187);
                    auVar167 = vfmadd213ps_avx512vl(auVar171,auVar261,auVar167);
                    auVar171 = vaddps_avx512vl(auVar167,auVar179);
                    auVar167 = vcvttps2dq_avx512vl(auVar175);
                    auVar167 = vpslld_avx2(auVar167,0x17);
                    auVar167 = vpaddd_avx2(auVar167,auVar292);
                    auVar114 = vfmadd213ps_fma(auVar167,auVar171,auVar179);
                    auVar167 = vrcpps_avx(ZEXT1632(auVar114));
                    auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar167,auVar179);
                    auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar167,auVar167);
                    auVar167 = vfnmadd213ps_avx512vl(ZEXT1632(auVar114),auVar166,auVar157);
                    auVar201._0_4_ = auVar167._0_4_ * auVar200._0_4_;
                    auVar201._4_4_ = auVar167._4_4_ * auVar200._4_4_;
                    auVar201._8_4_ = auVar167._8_4_ * auVar200._8_4_;
                    auVar201._12_4_ = auVar167._12_4_ * auVar200._12_4_;
                    auVar201._16_4_ = auVar167._16_4_ * auVar200._16_4_;
                    auVar201._20_4_ = auVar167._20_4_ * auVar200._20_4_;
                    auVar201._24_4_ = auVar167._24_4_ * auVar200._24_4_;
                    auVar167 = auVar201._0_32_;
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar243._4_4_ = uVar1;
                    auVar243._0_4_ = uVar1;
                    auVar243._8_4_ = uVar1;
                    auVar243._12_4_ = uVar1;
                    auVar243._16_4_ = uVar1;
                    auVar243._20_4_ = uVar1;
                    auVar243._24_4_ = uVar1;
                    auVar243._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar47._4_4_ = uVar1;
                    auVar47._0_4_ = uVar1;
                    auVar47._8_4_ = uVar1;
                    auVar47._12_4_ = uVar1;
                    auVar47._16_4_ = uVar1;
                    auVar47._20_4_ = uVar1;
                    auVar47._24_4_ = uVar1;
                    auVar47._28_4_ = uVar1;
                    auVar167 = vfmadd213ps_avx512vl(auVar243,auVar167,auVar47);
                    auVar167 = vmaxps_avx(auVar167,auVar171);
                    auVar167 = vminps_avx(auVar167,auVar179);
                    auVar202._0_4_ = auVar167._0_4_ * auVar200._0_4_;
                    auVar202._4_4_ = auVar167._4_4_ * auVar200._4_4_;
                    auVar202._8_4_ = auVar167._8_4_ * auVar200._8_4_;
                    auVar202._12_4_ = auVar167._12_4_ * auVar200._12_4_;
                    auVar202._16_4_ = auVar167._16_4_ * auVar200._16_4_;
                    auVar202._20_4_ = auVar167._20_4_ * auVar200._20_4_;
                    auVar202._24_4_ = auVar167._24_4_ * auVar200._24_4_;
                    auVar202._28_36_ = auVar201._28_36_;
                    auVar167 = auVar202._0_32_;
                  }
                }
                *pauVar91 = auVar167;
                pauVar91 = pauVar91 + 1;
                iVar86 = iVar86 + 8;
                bVar110 = iVar105 != iVar5;
                iVar105 = iVar105 + 1;
              } while (bVar110);
            }
            local_160 = local_160 + 1;
          } while (local_160 != uVar79);
        }
        if (iVar4 == 1 && (bVar111 && bVar109)) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_158 = 0;
          auVar209._8_4_ = 0x42b0c0a5;
          auVar209._0_8_ = 0x42b0c0a542b0c0a5;
          auVar209._12_4_ = 0x42b0c0a5;
          auVar209._16_4_ = 0x42b0c0a5;
          auVar209._20_4_ = 0x42b0c0a5;
          auVar209._24_4_ = 0x42b0c0a5;
          auVar209._28_4_ = 0x42b0c0a5;
          auVar214._8_4_ = 0xc2b0c0a5;
          auVar214._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar214._12_4_ = 0xc2b0c0a5;
          auVar214._16_4_ = 0xc2b0c0a5;
          auVar214._20_4_ = 0xc2b0c0a5;
          auVar214._24_4_ = 0xc2b0c0a5;
          auVar214._28_4_ = 0xc2b0c0a5;
          auVar218._8_4_ = 0x3f000000;
          auVar218._0_8_ = 0x3f0000003f000000;
          auVar218._12_4_ = 0x3f000000;
          auVar218._16_4_ = 0x3f000000;
          auVar218._20_4_ = 0x3f000000;
          auVar218._24_4_ = 0x3f000000;
          auVar218._28_4_ = 0x3f000000;
          auVar222._8_4_ = 0x3fb8aa3b;
          auVar222._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar222._12_4_ = 0x3fb8aa3b;
          auVar222._16_4_ = 0x3fb8aa3b;
          auVar222._20_4_ = 0x3fb8aa3b;
          auVar222._24_4_ = 0x3fb8aa3b;
          auVar222._28_4_ = 0x3fb8aa3b;
          auVar226._8_4_ = 0x3f800000;
          auVar226._0_8_ = 0x3f8000003f800000;
          auVar226._12_4_ = 0x3f800000;
          auVar226._16_4_ = 0x3f800000;
          auVar226._20_4_ = 0x3f800000;
          auVar226._24_4_ = 0x3f800000;
          auVar226._28_4_ = 0x3f800000;
          auVar230._8_4_ = 0x3f318000;
          auVar230._0_8_ = 0x3f3180003f318000;
          auVar230._12_4_ = 0x3f318000;
          auVar230._16_4_ = 0x3f318000;
          auVar230._20_4_ = 0x3f318000;
          auVar230._24_4_ = 0x3f318000;
          auVar230._28_4_ = 0x3f318000;
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar270._8_4_ = 0x3ab743ce;
          auVar270._0_8_ = 0x3ab743ce3ab743ce;
          auVar270._12_4_ = 0x3ab743ce;
          auVar270._16_4_ = 0x3ab743ce;
          auVar270._20_4_ = 0x3ab743ce;
          auVar270._24_4_ = 0x3ab743ce;
          auVar270._28_4_ = 0x3ab743ce;
          auVar275._8_4_ = 0x3c088908;
          auVar275._0_8_ = 0x3c0889083c088908;
          auVar275._12_4_ = 0x3c088908;
          auVar275._16_4_ = 0x3c088908;
          auVar275._20_4_ = 0x3c088908;
          auVar275._24_4_ = 0x3c088908;
          auVar275._28_4_ = 0x3c088908;
          auVar281._8_4_ = 0x3d2aa9c1;
          auVar281._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar281._12_4_ = 0x3d2aa9c1;
          auVar281._16_4_ = 0x3d2aa9c1;
          auVar281._20_4_ = 0x3d2aa9c1;
          auVar281._24_4_ = 0x3d2aa9c1;
          auVar281._28_4_ = 0x3d2aa9c1;
          auVar287._8_4_ = 0x3e2aaaaa;
          auVar287._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar287._12_4_ = 0x3e2aaaaa;
          auVar287._16_4_ = 0x3e2aaaaa;
          auVar287._20_4_ = 0x3e2aaaaa;
          auVar287._24_4_ = 0x3e2aaaaa;
          auVar287._28_4_ = 0x3e2aaaaa;
          auVar293._8_4_ = 0x3f800000;
          auVar293._0_8_ = 0x3f8000003f800000;
          auVar293._12_4_ = 0x3f800000;
          auVar293._16_4_ = 0x3f800000;
          auVar293._20_4_ = 0x3f800000;
          auVar293._24_4_ = 0x3f800000;
          auVar293._28_4_ = 0x3f800000;
          auVar299._8_4_ = 0xb95e8083;
          auVar299._0_8_ = 0xb95e8083b95e8083;
          auVar299._12_4_ = 0xb95e8083;
          auVar299._16_4_ = 0xb95e8083;
          auVar299._20_4_ = 0xb95e8083;
          auVar299._24_4_ = 0xb95e8083;
          auVar299._28_4_ = 0xb95e8083;
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar160 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar163 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar164 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar177 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar178 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          do {
            if (-1 < iVar5) {
              pauVar91 = (undefined1 (*) [32])
                         ((long)top_blob->w * local_158 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar105 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar200 = ZEXT3264(*(undefined1 (*) [32])
                                       (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                       local_158 * 0x20));
                }
                if (0 < iVar78) {
                  pauVar107 = (undefined1 (*) [32])
                              ((this->weight_data_packed).cstep * local_158 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var9 = pp_Var8[-3];
                  iVar86 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  puVar101 = (undefined4 *)
                             ((long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar105) * 4 +
                             (long)local_e8.data);
                  uVar87 = 0;
                  do {
                    if (0 < iVar86) {
                      pauVar80 = pauVar107;
                      puVar94 = puVar101;
                      iVar85 = iVar86;
                      do {
                        uVar1 = *puVar94;
                        auVar244._4_4_ = uVar1;
                        auVar244._0_4_ = uVar1;
                        auVar244._8_4_ = uVar1;
                        auVar244._12_4_ = uVar1;
                        auVar244._16_4_ = uVar1;
                        auVar244._20_4_ = uVar1;
                        auVar244._24_4_ = uVar1;
                        auVar244._28_4_ = uVar1;
                        auVar114 = vfmadd231ps_fma(auVar200._0_32_,auVar244,*pauVar80);
                        auVar200 = ZEXT1664(auVar114);
                        pauVar80 = pauVar80 + 1;
                        puVar94 = puVar94 + *(int *)(&this->field_0xd8 + (long)p_Var9);
                        iVar85 = iVar85 + -1;
                      } while (iVar85 != 0);
                      pauVar107 = pauVar107 + (ulong)(iVar86 - 1) + 1;
                    }
                    uVar87 = uVar87 + 1;
                    puVar101 = (undefined4 *)
                               ((long)puVar101 +
                               (long)local_e8.w *
                               CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize));
                  } while (uVar87 != uVar104);
                }
                auVar187 = auVar200._0_32_;
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  auVar188 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar203._28_36_ = auVar200._28_36_;
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar187 = vmaxps_avx(auVar187,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar179 = vmaxps_avx(auVar187,auVar188);
                    auVar187 = vminps_avx(auVar187,auVar188);
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar66._4_4_ = uVar1;
                    auVar66._0_4_ = uVar1;
                    auVar66._8_4_ = uVar1;
                    auVar66._12_4_ = uVar1;
                    auVar66._16_4_ = uVar1;
                    auVar66._20_4_ = uVar1;
                    auVar66._24_4_ = uVar1;
                    auVar66._28_4_ = uVar1;
                    auVar187 = vfmadd132ps_avx512vl(auVar187,auVar179,auVar66);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar64._4_4_ = uVar1;
                    auVar64._0_4_ = uVar1;
                    auVar64._8_4_ = uVar1;
                    auVar64._12_4_ = uVar1;
                    auVar64._16_4_ = uVar1;
                    auVar64._20_4_ = uVar1;
                    auVar64._24_4_ = uVar1;
                    auVar64._28_4_ = uVar1;
                    auVar187 = vmaxps_avx512vl(auVar187,auVar64);
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar65._4_4_ = uVar1;
                    auVar65._0_4_ = uVar1;
                    auVar65._8_4_ = uVar1;
                    auVar65._12_4_ = uVar1;
                    auVar65._16_4_ = uVar1;
                    auVar65._20_4_ = uVar1;
                    auVar65._24_4_ = uVar1;
                    auVar65._28_4_ = uVar1;
                    auVar187 = vminps_avx512vl(auVar187,auVar65);
                    break;
                  case 4:
                    auVar62._8_4_ = 0x80000000;
                    auVar62._0_8_ = 0x8000000080000000;
                    auVar62._12_4_ = 0x80000000;
                    auVar62._16_4_ = 0x80000000;
                    auVar62._20_4_ = 0x80000000;
                    auVar62._24_4_ = 0x80000000;
                    auVar62._28_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(auVar187,auVar62);
                    auVar187 = vminps_avx(auVar187,auVar209);
                    auVar187 = vmaxps_avx(auVar187,auVar214);
                    auVar114 = vfmadd231ps_fma(auVar218,auVar187,auVar222);
                    auVar188 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar188,1);
                    auVar179 = vsubps_avx512vl(auVar188,auVar226);
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar186._0_4_ =
                         (uint)bVar110 * auVar179._0_4_ | (uint)!bVar110 * auVar188._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar186._4_4_ =
                         (uint)bVar110 * auVar179._4_4_ | (uint)!bVar110 * auVar188._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar186._8_4_ =
                         (uint)bVar110 * auVar179._8_4_ | (uint)!bVar110 * auVar188._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar186._12_4_ =
                         (uint)bVar110 * auVar179._12_4_ | (uint)!bVar110 * auVar188._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar186._16_4_ =
                         (uint)bVar110 * auVar179._16_4_ | (uint)!bVar110 * auVar188._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar186._20_4_ =
                         (uint)bVar110 * auVar179._20_4_ | (uint)!bVar110 * auVar188._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar186._24_4_ =
                         (uint)bVar110 * auVar179._24_4_ | (uint)!bVar110 * auVar188._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar186._28_4_ =
                         (uint)bVar110 * auVar179._28_4_ | (uint)!bVar110 * auVar188._28_4_;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar186,auVar230);
                    auVar63._8_4_ = 0x395e8083;
                    auVar63._0_8_ = 0x395e8083395e8083;
                    auVar63._12_4_ = 0x395e8083;
                    auVar63._16_4_ = 0x395e8083;
                    auVar63._20_4_ = 0x395e8083;
                    auVar63._24_4_ = 0x395e8083;
                    auVar63._28_4_ = 0x395e8083;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar186,auVar63);
                    auVar245._0_4_ = auVar187._0_4_ * auVar187._0_4_;
                    auVar245._4_4_ = auVar187._4_4_ * auVar187._4_4_;
                    auVar245._8_4_ = auVar187._8_4_ * auVar187._8_4_;
                    auVar245._12_4_ = auVar187._12_4_ * auVar187._12_4_;
                    auVar245._16_4_ = auVar187._16_4_ * auVar187._16_4_;
                    auVar245._20_4_ = auVar187._20_4_ * auVar187._20_4_;
                    auVar245._24_4_ = auVar187._24_4_ * auVar187._24_4_;
                    auVar245._28_4_ = 0;
                    auVar114 = vfmadd213ps_fma(auVar156,auVar187,auVar270);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar275);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar281);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar287);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar218);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar245,auVar187);
                    auVar246._0_4_ = auVar114._0_4_ + 1.0;
                    auVar246._4_4_ = auVar114._4_4_ + 1.0;
                    auVar246._8_4_ = auVar114._8_4_ + 1.0;
                    auVar246._12_4_ = auVar114._12_4_ + 1.0;
                    auVar246._16_4_ = 0x3f800000;
                    auVar246._20_4_ = 0x3f800000;
                    auVar246._24_4_ = 0x3f800000;
                    auVar246._28_4_ = 0x3f800000;
                    auVar187 = vcvttps2dq_avx512vl(auVar186);
                    auVar187 = vpslld_avx2(auVar187,0x17);
                    auVar187 = vpaddd_avx2(auVar293,auVar187);
                    auVar114 = vfmadd213ps_fma(auVar187,auVar246,auVar226);
                    auVar187 = vrcpps_avx(ZEXT1632(auVar114));
                    auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar187,auVar226);
                    auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar187,auVar187);
                    auVar187 = ZEXT1632(auVar114);
                    break;
                  case 5:
                    auVar187 = vminps_avx(auVar187,auVar209);
                    auVar187 = vmaxps_avx(auVar187,auVar214);
                    auVar114 = vfmadd213ps_fma(auVar222,auVar187,auVar218);
                    auVar179 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar179,1);
                    auVar180 = vsubps_avx512vl(auVar179,auVar226);
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar181._0_4_ =
                         (uint)bVar110 * auVar180._0_4_ | (uint)!bVar110 * auVar179._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar181._4_4_ =
                         (uint)bVar110 * auVar180._4_4_ | (uint)!bVar110 * auVar179._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar181._8_4_ =
                         (uint)bVar110 * auVar180._8_4_ | (uint)!bVar110 * auVar179._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar181._12_4_ =
                         (uint)bVar110 * auVar180._12_4_ | (uint)!bVar110 * auVar179._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar181._16_4_ =
                         (uint)bVar110 * auVar180._16_4_ | (uint)!bVar110 * auVar179._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar181._20_4_ =
                         (uint)bVar110 * auVar180._20_4_ | (uint)!bVar110 * auVar179._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar181._24_4_ =
                         (uint)bVar110 * auVar180._24_4_ | (uint)!bVar110 * auVar179._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar181._28_4_ =
                         (uint)bVar110 * auVar180._28_4_ | (uint)!bVar110 * auVar179._28_4_;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar181,auVar230);
                    auVar187 = vfnmsub231ps_avx512vl(auVar187,auVar181,auVar299);
                    auVar262._0_4_ = auVar187._0_4_ * auVar187._0_4_;
                    auVar262._4_4_ = auVar187._4_4_ * auVar187._4_4_;
                    auVar262._8_4_ = auVar187._8_4_ * auVar187._8_4_;
                    auVar262._12_4_ = auVar187._12_4_ * auVar187._12_4_;
                    auVar262._16_4_ = auVar187._16_4_ * auVar187._16_4_;
                    auVar262._20_4_ = auVar187._20_4_ * auVar187._20_4_;
                    auVar262._24_4_ = auVar187._24_4_ * auVar187._24_4_;
                    auVar262._28_4_ = 0;
                    auVar179 = vfmadd213ps_avx512vl(auVar156,auVar187,auVar270);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar275);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar281);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar287);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar218);
                    auVar187 = vfmadd213ps_avx512vl(auVar179,auVar262,auVar187);
                    auVar179 = vaddps_avx512vl(auVar187,auVar226);
                    auVar187 = vcvttps2dq_avx512vl(auVar181);
                    auVar187 = vpslld_avx2(auVar187,0x17);
                    auVar187 = vpaddd_avx2(auVar187,auVar293);
                    auVar114 = vfmadd213ps_fma(auVar187,auVar179,auVar226);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar188,2);
                    auVar59._8_4_ = 0x800000;
                    auVar59._0_8_ = 0x80000000800000;
                    auVar59._12_4_ = 0x800000;
                    auVar59._16_4_ = 0x800000;
                    auVar59._20_4_ = 0x800000;
                    auVar59._24_4_ = 0x800000;
                    auVar59._28_4_ = 0x800000;
                    auVar187 = vmaxps_avx512vl(ZEXT1632(auVar114),auVar59);
                    auVar180 = vpsrld_avx2(auVar187,0x17);
                    auVar188 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar60._8_4_ = 0x3f000000;
                    auVar60._0_8_ = 0x3f0000003f000000;
                    auVar60._12_4_ = 0x3f000000;
                    auVar60._16_4_ = 0x3f000000;
                    auVar60._20_4_ = 0x3f000000;
                    auVar60._24_4_ = 0x3f000000;
                    auVar60._28_4_ = 0x3f000000;
                    auVar187 = vpternlogd_avx512vl(auVar187,auVar188,auVar60,0xea);
                    uVar92 = vcmpps_avx512vl(auVar187,auVar157,1);
                    auVar188 = vaddps_avx512vl(auVar187,auVar158);
                    auVar187 = vaddps_avx512vl(auVar188,auVar187);
                    bVar110 = (bool)((byte)uVar92 & 1);
                    auVar182._0_4_ =
                         (uint)bVar110 * auVar187._0_4_ | (uint)!bVar110 * auVar188._0_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar182._4_4_ =
                         (uint)bVar110 * auVar187._4_4_ | (uint)!bVar110 * auVar188._4_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar182._8_4_ =
                         (uint)bVar110 * auVar187._8_4_ | (uint)!bVar110 * auVar188._8_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar182._12_4_ =
                         (uint)bVar110 * auVar187._12_4_ | (uint)!bVar110 * auVar188._12_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar182._16_4_ =
                         (uint)bVar110 * auVar187._16_4_ | (uint)!bVar110 * auVar188._16_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar182._20_4_ =
                         (uint)bVar110 * auVar187._20_4_ | (uint)!bVar110 * auVar188._20_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar182._24_4_ =
                         (uint)bVar110 * auVar187._24_4_ | (uint)!bVar110 * auVar188._24_4_;
                    bVar110 = SUB81(uVar92 >> 7,0);
                    auVar182._28_4_ =
                         (uint)bVar110 * auVar187._28_4_ | (uint)!bVar110 * auVar188._28_4_;
                    auVar188 = vmulps_avx512vl(auVar182,auVar182);
                    auVar187 = vfmadd213ps_avx512vl(auVar159,auVar182,auVar160);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar182,auVar161);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar182,auVar162);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar182,auVar163);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar182,auVar164);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar182,auVar165);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar182,auVar166);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar182,auVar177);
                    auVar179 = vmulps_avx512vl(auVar188,auVar182);
                    auVar179 = vmulps_avx512vl(auVar179,auVar187);
                    auVar61._8_4_ = 0xffffff82;
                    auVar61._0_8_ = 0xffffff82ffffff82;
                    auVar61._12_4_ = 0xffffff82;
                    auVar61._16_4_ = 0xffffff82;
                    auVar61._20_4_ = 0xffffff82;
                    auVar61._24_4_ = 0xffffff82;
                    auVar61._28_4_ = 0xffffff82;
                    auVar187 = vpaddd_avx512vl(auVar180,auVar61);
                    auVar187 = vcvtdq2ps_avx(auVar187);
                    auVar180 = vsubps_avx512vl(auVar187,auVar226);
                    bVar110 = (bool)((byte)uVar92 & 1);
                    auVar183._0_4_ =
                         (uint)bVar110 * auVar180._0_4_ | (uint)!bVar110 * auVar187._0_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar183._4_4_ =
                         (uint)bVar110 * auVar180._4_4_ | (uint)!bVar110 * auVar187._4_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar183._8_4_ =
                         (uint)bVar110 * auVar180._8_4_ | (uint)!bVar110 * auVar187._8_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar183._12_4_ =
                         (uint)bVar110 * auVar180._12_4_ | (uint)!bVar110 * auVar187._12_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar183._16_4_ =
                         (uint)bVar110 * auVar180._16_4_ | (uint)!bVar110 * auVar187._16_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar183._20_4_ =
                         (uint)bVar110 * auVar180._20_4_ | (uint)!bVar110 * auVar187._20_4_;
                    bVar110 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar183._24_4_ =
                         (uint)bVar110 * auVar180._24_4_ | (uint)!bVar110 * auVar187._24_4_;
                    bVar110 = SUB81(uVar92 >> 7,0);
                    auVar183._28_4_ =
                         (uint)bVar110 * auVar180._28_4_ | (uint)!bVar110 * auVar187._28_4_;
                    auVar187 = vfmadd231ps_avx512vl(auVar179,auVar183,auVar299);
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar218,auVar188);
                    auVar187 = vsubps_avx512vl(auVar187,auVar182);
                    auVar114 = vfmsub231ps_fma(auVar187,auVar230,auVar183);
                    auVar187 = vmulps_avx512vl(ZEXT1632(auVar114),auVar178);
                    auVar188 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar184._0_4_ =
                         (uint)bVar110 * auVar188._0_4_ | (uint)!bVar110 * auVar187._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar184._4_4_ =
                         (uint)bVar110 * auVar188._4_4_ | (uint)!bVar110 * auVar187._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar184._8_4_ =
                         (uint)bVar110 * auVar188._8_4_ | (uint)!bVar110 * auVar187._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar184._12_4_ =
                         (uint)bVar110 * auVar188._12_4_ | (uint)!bVar110 * auVar187._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar184._16_4_ =
                         (uint)bVar110 * auVar188._16_4_ | (uint)!bVar110 * auVar187._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar184._20_4_ =
                         (uint)bVar110 * auVar188._20_4_ | (uint)!bVar110 * auVar187._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar184._24_4_ =
                         (uint)bVar110 * auVar188._24_4_ | (uint)!bVar110 * auVar187._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar184._28_4_ =
                         (uint)bVar110 * auVar188._28_4_ | (uint)!bVar110 * auVar187._28_4_;
                    auVar187 = vminps_avx(auVar184,auVar209);
                    auVar187 = vmaxps_avx(auVar187,auVar214);
                    auVar114 = vfmadd213ps_fma(auVar222,auVar187,auVar218);
                    auVar188 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar188,1);
                    auVar179 = vsubps_avx512vl(auVar188,auVar226);
                    bVar110 = (bool)((byte)uVar87 & 1);
                    auVar185._0_4_ =
                         (uint)bVar110 * auVar179._0_4_ | (uint)!bVar110 * auVar188._0_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar185._4_4_ =
                         (uint)bVar110 * auVar179._4_4_ | (uint)!bVar110 * auVar188._4_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar185._8_4_ =
                         (uint)bVar110 * auVar179._8_4_ | (uint)!bVar110 * auVar188._8_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar185._12_4_ =
                         (uint)bVar110 * auVar179._12_4_ | (uint)!bVar110 * auVar188._12_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar185._16_4_ =
                         (uint)bVar110 * auVar179._16_4_ | (uint)!bVar110 * auVar188._16_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar185._20_4_ =
                         (uint)bVar110 * auVar179._20_4_ | (uint)!bVar110 * auVar188._20_4_;
                    bVar110 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar185._24_4_ =
                         (uint)bVar110 * auVar179._24_4_ | (uint)!bVar110 * auVar188._24_4_;
                    bVar110 = SUB81(uVar87 >> 7,0);
                    auVar185._28_4_ =
                         (uint)bVar110 * auVar179._28_4_ | (uint)!bVar110 * auVar188._28_4_;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar185,auVar230);
                    auVar187 = vfnmsub231ps_avx512vl(auVar187,auVar185,auVar299);
                    auVar263._0_4_ = auVar187._0_4_ * auVar187._0_4_;
                    auVar263._4_4_ = auVar187._4_4_ * auVar187._4_4_;
                    auVar263._8_4_ = auVar187._8_4_ * auVar187._8_4_;
                    auVar263._12_4_ = auVar187._12_4_ * auVar187._12_4_;
                    auVar263._16_4_ = auVar187._16_4_ * auVar187._16_4_;
                    auVar263._20_4_ = auVar187._20_4_ * auVar187._20_4_;
                    auVar263._24_4_ = auVar187._24_4_ * auVar187._24_4_;
                    auVar263._28_4_ = 0;
                    auVar188 = vfmadd213ps_avx512vl(auVar156,auVar187,auVar270);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar275);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar281);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar287);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar218);
                    auVar187 = vfmadd213ps_avx512vl(auVar188,auVar263,auVar187);
                    auVar188 = vaddps_avx512vl(auVar187,auVar226);
                    auVar187 = vcvttps2dq_avx512vl(auVar185);
                    auVar187 = vpslld_avx2(auVar187,0x17);
                    auVar187 = vpaddd_avx2(auVar187,auVar293);
                    auVar114 = vfmadd213ps_fma(auVar187,auVar188,auVar226);
                    auVar187 = vrcpps_avx(ZEXT1632(auVar114));
                    auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar187,auVar226);
                    auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar187,auVar187);
                    auVar187 = vfnmadd213ps_avx512vl(ZEXT1632(auVar114),auVar178,auVar158);
                    auVar203._0_4_ = auVar187._0_4_ * auVar200._0_4_;
                    auVar203._4_4_ = auVar187._4_4_ * auVar200._4_4_;
                    auVar203._8_4_ = auVar187._8_4_ * auVar200._8_4_;
                    auVar203._12_4_ = auVar187._12_4_ * auVar200._12_4_;
                    auVar203._16_4_ = auVar187._16_4_ * auVar200._16_4_;
                    auVar203._20_4_ = auVar187._20_4_ * auVar200._20_4_;
                    auVar203._24_4_ = auVar187._24_4_ * auVar200._24_4_;
                    auVar187 = auVar203._0_32_;
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar247._4_4_ = uVar1;
                    auVar247._0_4_ = uVar1;
                    auVar247._8_4_ = uVar1;
                    auVar247._12_4_ = uVar1;
                    auVar247._16_4_ = uVar1;
                    auVar247._20_4_ = uVar1;
                    auVar247._24_4_ = uVar1;
                    auVar247._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar58._4_4_ = uVar1;
                    auVar58._0_4_ = uVar1;
                    auVar58._8_4_ = uVar1;
                    auVar58._12_4_ = uVar1;
                    auVar58._16_4_ = uVar1;
                    auVar58._20_4_ = uVar1;
                    auVar58._24_4_ = uVar1;
                    auVar58._28_4_ = uVar1;
                    auVar187 = vfmadd213ps_avx512vl(auVar247,auVar187,auVar58);
                    auVar187 = vmaxps_avx(auVar187,auVar188);
                    auVar187 = vminps_avx(auVar187,auVar226);
                    auVar204._0_4_ = auVar187._0_4_ * auVar200._0_4_;
                    auVar204._4_4_ = auVar187._4_4_ * auVar200._4_4_;
                    auVar204._8_4_ = auVar187._8_4_ * auVar200._8_4_;
                    auVar204._12_4_ = auVar187._12_4_ * auVar200._12_4_;
                    auVar204._16_4_ = auVar187._16_4_ * auVar200._16_4_;
                    auVar204._20_4_ = auVar187._20_4_ * auVar200._20_4_;
                    auVar204._24_4_ = auVar187._24_4_ * auVar200._24_4_;
                    auVar204._28_36_ = auVar203._28_36_;
                    auVar187 = auVar204._0_32_;
                  }
                }
                *pauVar91 = auVar187;
                pauVar91 = pauVar91 + 1;
                bVar110 = iVar105 != iVar5;
                iVar105 = iVar105 + 1;
              } while (bVar110);
            }
            local_158 = local_158 + 1;
          } while (local_158 != uVar79);
        }
        if ((bVar111 && bVar109) && iVar4 == 4) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_160 = 0;
          auVar210._8_4_ = 0x42b0c0a5;
          auVar210._0_8_ = 0x42b0c0a542b0c0a5;
          auVar210._12_4_ = 0x42b0c0a5;
          auVar210._16_4_ = 0x42b0c0a5;
          auVar210._20_4_ = 0x42b0c0a5;
          auVar210._24_4_ = 0x42b0c0a5;
          auVar210._28_4_ = 0x42b0c0a5;
          auVar215._8_4_ = 0xc2b0c0a5;
          auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar215._12_4_ = 0xc2b0c0a5;
          auVar215._16_4_ = 0xc2b0c0a5;
          auVar215._20_4_ = 0xc2b0c0a5;
          auVar215._24_4_ = 0xc2b0c0a5;
          auVar215._28_4_ = 0xc2b0c0a5;
          auVar219._8_4_ = 0x3f000000;
          auVar219._0_8_ = 0x3f0000003f000000;
          auVar219._12_4_ = 0x3f000000;
          auVar219._16_4_ = 0x3f000000;
          auVar219._20_4_ = 0x3f000000;
          auVar219._24_4_ = 0x3f000000;
          auVar219._28_4_ = 0x3f000000;
          auVar223._8_4_ = 0x3fb8aa3b;
          auVar223._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar223._12_4_ = 0x3fb8aa3b;
          auVar223._16_4_ = 0x3fb8aa3b;
          auVar223._20_4_ = 0x3fb8aa3b;
          auVar223._24_4_ = 0x3fb8aa3b;
          auVar223._28_4_ = 0x3fb8aa3b;
          auVar227._8_4_ = 0x3f800000;
          auVar227._0_8_ = 0x3f8000003f800000;
          auVar227._12_4_ = 0x3f800000;
          auVar227._16_4_ = 0x3f800000;
          auVar227._20_4_ = 0x3f800000;
          auVar227._24_4_ = 0x3f800000;
          auVar227._28_4_ = 0x3f800000;
          auVar231._8_4_ = 0x3f318000;
          auVar231._0_8_ = 0x3f3180003f318000;
          auVar231._12_4_ = 0x3f318000;
          auVar231._16_4_ = 0x3f318000;
          auVar231._20_4_ = 0x3f318000;
          auVar231._24_4_ = 0x3f318000;
          auVar231._28_4_ = 0x3f318000;
          auVar156 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar271._8_4_ = 0x3ab743ce;
          auVar271._0_8_ = 0x3ab743ce3ab743ce;
          auVar271._12_4_ = 0x3ab743ce;
          auVar271._16_4_ = 0x3ab743ce;
          auVar271._20_4_ = 0x3ab743ce;
          auVar271._24_4_ = 0x3ab743ce;
          auVar271._28_4_ = 0x3ab743ce;
          auVar276._8_4_ = 0x3c088908;
          auVar276._0_8_ = 0x3c0889083c088908;
          auVar276._12_4_ = 0x3c088908;
          auVar276._16_4_ = 0x3c088908;
          auVar276._20_4_ = 0x3c088908;
          auVar276._24_4_ = 0x3c088908;
          auVar276._28_4_ = 0x3c088908;
          auVar282._8_4_ = 0x3d2aa9c1;
          auVar282._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar282._12_4_ = 0x3d2aa9c1;
          auVar282._16_4_ = 0x3d2aa9c1;
          auVar282._20_4_ = 0x3d2aa9c1;
          auVar282._24_4_ = 0x3d2aa9c1;
          auVar282._28_4_ = 0x3d2aa9c1;
          auVar288._8_4_ = 0x3e2aaaaa;
          auVar288._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar288._12_4_ = 0x3e2aaaaa;
          auVar288._16_4_ = 0x3e2aaaaa;
          auVar288._20_4_ = 0x3e2aaaaa;
          auVar288._24_4_ = 0x3e2aaaaa;
          auVar288._28_4_ = 0x3e2aaaaa;
          auVar294._8_4_ = 0x3f800000;
          auVar294._0_8_ = 0x3f8000003f800000;
          auVar294._12_4_ = 0x3f800000;
          auVar294._16_4_ = 0x3f800000;
          auVar294._20_4_ = 0x3f800000;
          auVar294._24_4_ = 0x3f800000;
          auVar294._28_4_ = 0x3f800000;
          auVar300._8_4_ = 0xb95e8083;
          auVar300._0_8_ = 0xb95e8083b95e8083;
          auVar300._12_4_ = 0xb95e8083;
          auVar300._16_4_ = 0xb95e8083;
          auVar300._20_4_ = 0xb95e8083;
          auVar300._24_4_ = 0xb95e8083;
          auVar300._28_4_ = 0xb95e8083;
          auVar157 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar158 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar159 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar160 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar161 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar163 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar164 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar166 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar177 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar178 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
          do {
            if (-1 < iVar5) {
              pauVar91 = (undefined1 (*) [32])
                         ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar86 = 0;
              iVar105 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar200 = ZEXT3264(*(undefined1 (*) [32])
                                       (*(long *)(&this->field_0x190 + (long)p_Var6) +
                                       local_160 * 0x20));
                }
                if (0 < iVar78) {
                  pauVar107 = (undefined1 (*) [32])
                              ((this->weight_data_packed).cstep * local_160 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var9 = pp_Var8[-3];
                  iVar85 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  puVar100 = (uint *)((long)local_e8.data +
                                     (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar86) * 4
                                     + 0xc);
                  uVar87 = 0;
                  do {
                    if (0 < iVar85) {
                      puVar95 = puVar100;
                      pauVar80 = pauVar107;
                      iVar102 = iVar85;
                      do {
                        uVar2 = puVar95[-3];
                        auVar248._4_4_ = uVar2;
                        auVar248._0_4_ = uVar2;
                        auVar248._8_4_ = uVar2;
                        auVar248._12_4_ = uVar2;
                        auVar248._16_4_ = uVar2;
                        auVar248._20_4_ = uVar2;
                        auVar248._24_4_ = uVar2;
                        auVar248._28_4_ = uVar2;
                        uVar2 = puVar95[-2];
                        auVar264._4_4_ = uVar2;
                        auVar264._0_4_ = uVar2;
                        auVar264._8_4_ = uVar2;
                        auVar264._12_4_ = uVar2;
                        auVar264._16_4_ = uVar2;
                        auVar264._20_4_ = uVar2;
                        auVar264._24_4_ = uVar2;
                        auVar264._28_4_ = uVar2;
                        auVar187 = vbroadcastss_avx512vl(ZEXT416(puVar95[-1]));
                        auVar188 = vbroadcastss_avx512vl(ZEXT416(*puVar95));
                        auVar114 = vfmadd132ps_fma(auVar248,auVar200._0_32_,*pauVar80);
                        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar264,pauVar80[1]);
                        auVar187 = vfmadd231ps_avx512vl(ZEXT1632(auVar114),auVar187,pauVar80[2]);
                        auVar187 = vfmadd231ps_avx512vl(auVar187,auVar188,pauVar80[3]);
                        auVar200 = ZEXT3264(auVar187);
                        pauVar80 = pauVar80 + 4;
                        puVar95 = puVar95 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 2);
                        iVar102 = iVar102 + -1;
                      } while (iVar102 != 0);
                      pauVar107 = pauVar107 + (ulong)(iVar85 - 1) * 4 + 4;
                    }
                    uVar87 = uVar87 + 1;
                    puVar100 = (uint *)((long)puVar100 +
                                       (long)local_e8.w *
                                       CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize));
                  } while (uVar87 != uVar104);
                }
                auVar187 = auVar200._0_32_;
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  auVar188 = ZEXT1632(ZEXT816(0) << 0x40);
                  auVar205._28_36_ = auVar200._28_36_;
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar187 = vmaxps_avx(auVar187,ZEXT1632(ZEXT816(0) << 0x40));
                    break;
                  case 2:
                    auVar179 = vmaxps_avx(auVar187,auVar188);
                    auVar187 = vminps_avx(auVar187,auVar188);
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar75._4_4_ = uVar1;
                    auVar75._0_4_ = uVar1;
                    auVar75._8_4_ = uVar1;
                    auVar75._12_4_ = uVar1;
                    auVar75._16_4_ = uVar1;
                    auVar75._20_4_ = uVar1;
                    auVar75._24_4_ = uVar1;
                    auVar75._28_4_ = uVar1;
                    auVar187 = vfmadd132ps_avx512vl(auVar187,auVar179,auVar75);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar73._4_4_ = uVar1;
                    auVar73._0_4_ = uVar1;
                    auVar73._8_4_ = uVar1;
                    auVar73._12_4_ = uVar1;
                    auVar73._16_4_ = uVar1;
                    auVar73._20_4_ = uVar1;
                    auVar73._24_4_ = uVar1;
                    auVar73._28_4_ = uVar1;
                    auVar187 = vmaxps_avx512vl(auVar187,auVar73);
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar74._4_4_ = uVar1;
                    auVar74._0_4_ = uVar1;
                    auVar74._8_4_ = uVar1;
                    auVar74._12_4_ = uVar1;
                    auVar74._16_4_ = uVar1;
                    auVar74._20_4_ = uVar1;
                    auVar74._24_4_ = uVar1;
                    auVar74._28_4_ = uVar1;
                    auVar187 = vminps_avx512vl(auVar187,auVar74);
                    break;
                  case 4:
                    auVar71._8_4_ = 0x80000000;
                    auVar71._0_8_ = 0x8000000080000000;
                    auVar71._12_4_ = 0x80000000;
                    auVar71._16_4_ = 0x80000000;
                    auVar71._20_4_ = 0x80000000;
                    auVar71._24_4_ = 0x80000000;
                    auVar71._28_4_ = 0x80000000;
                    auVar187 = vxorps_avx512vl(auVar187,auVar71);
                    auVar187 = vminps_avx(auVar187,auVar210);
                    auVar187 = vmaxps_avx(auVar187,auVar215);
                    auVar114 = vfmadd231ps_fma(auVar219,auVar187,auVar223);
                    auVar188 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar188,1);
                    auVar179 = vsubps_avx512vl(auVar188,auVar227);
                    bVar111 = (bool)((byte)uVar87 & 1);
                    auVar194._0_4_ =
                         (uint)bVar111 * auVar179._0_4_ | (uint)!bVar111 * auVar188._0_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar194._4_4_ =
                         (uint)bVar111 * auVar179._4_4_ | (uint)!bVar111 * auVar188._4_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar194._8_4_ =
                         (uint)bVar111 * auVar179._8_4_ | (uint)!bVar111 * auVar188._8_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar194._12_4_ =
                         (uint)bVar111 * auVar179._12_4_ | (uint)!bVar111 * auVar188._12_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar194._16_4_ =
                         (uint)bVar111 * auVar179._16_4_ | (uint)!bVar111 * auVar188._16_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar194._20_4_ =
                         (uint)bVar111 * auVar179._20_4_ | (uint)!bVar111 * auVar188._20_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar194._24_4_ =
                         (uint)bVar111 * auVar179._24_4_ | (uint)!bVar111 * auVar188._24_4_;
                    bVar111 = SUB81(uVar87 >> 7,0);
                    auVar194._28_4_ =
                         (uint)bVar111 * auVar179._28_4_ | (uint)!bVar111 * auVar188._28_4_;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar194,auVar231);
                    auVar72._8_4_ = 0x395e8083;
                    auVar72._0_8_ = 0x395e8083395e8083;
                    auVar72._12_4_ = 0x395e8083;
                    auVar72._16_4_ = 0x395e8083;
                    auVar72._20_4_ = 0x395e8083;
                    auVar72._24_4_ = 0x395e8083;
                    auVar72._28_4_ = 0x395e8083;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar194,auVar72);
                    auVar249._0_4_ = auVar187._0_4_ * auVar187._0_4_;
                    auVar249._4_4_ = auVar187._4_4_ * auVar187._4_4_;
                    auVar249._8_4_ = auVar187._8_4_ * auVar187._8_4_;
                    auVar249._12_4_ = auVar187._12_4_ * auVar187._12_4_;
                    auVar249._16_4_ = auVar187._16_4_ * auVar187._16_4_;
                    auVar249._20_4_ = auVar187._20_4_ * auVar187._20_4_;
                    auVar249._24_4_ = auVar187._24_4_ * auVar187._24_4_;
                    auVar249._28_4_ = 0;
                    auVar114 = vfmadd213ps_fma(auVar156,auVar187,auVar271);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar276);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar282);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar288);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar187,auVar219);
                    auVar114 = vfmadd213ps_fma(ZEXT1632(auVar114),auVar249,auVar187);
                    auVar250._0_4_ = auVar114._0_4_ + 1.0;
                    auVar250._4_4_ = auVar114._4_4_ + 1.0;
                    auVar250._8_4_ = auVar114._8_4_ + 1.0;
                    auVar250._12_4_ = auVar114._12_4_ + 1.0;
                    auVar250._16_4_ = 0x3f800000;
                    auVar250._20_4_ = 0x3f800000;
                    auVar250._24_4_ = 0x3f800000;
                    auVar250._28_4_ = 0x3f800000;
                    auVar187 = vcvttps2dq_avx512vl(auVar194);
                    auVar187 = vpslld_avx2(auVar187,0x17);
                    auVar187 = vpaddd_avx2(auVar294,auVar187);
                    auVar114 = vfmadd213ps_fma(auVar187,auVar250,auVar227);
                    auVar187 = vrcpps_avx(ZEXT1632(auVar114));
                    auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar187,auVar227);
                    auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar187,auVar187);
                    auVar187 = ZEXT1632(auVar114);
                    break;
                  case 5:
                    auVar187 = vminps_avx(auVar187,auVar210);
                    auVar187 = vmaxps_avx(auVar187,auVar215);
                    auVar114 = vfmadd213ps_fma(auVar223,auVar187,auVar219);
                    auVar179 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar179,1);
                    auVar180 = vsubps_avx512vl(auVar179,auVar227);
                    bVar111 = (bool)((byte)uVar87 & 1);
                    auVar189._0_4_ =
                         (uint)bVar111 * auVar180._0_4_ | (uint)!bVar111 * auVar179._0_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar189._4_4_ =
                         (uint)bVar111 * auVar180._4_4_ | (uint)!bVar111 * auVar179._4_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar189._8_4_ =
                         (uint)bVar111 * auVar180._8_4_ | (uint)!bVar111 * auVar179._8_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar189._12_4_ =
                         (uint)bVar111 * auVar180._12_4_ | (uint)!bVar111 * auVar179._12_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar189._16_4_ =
                         (uint)bVar111 * auVar180._16_4_ | (uint)!bVar111 * auVar179._16_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar189._20_4_ =
                         (uint)bVar111 * auVar180._20_4_ | (uint)!bVar111 * auVar179._20_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar189._24_4_ =
                         (uint)bVar111 * auVar180._24_4_ | (uint)!bVar111 * auVar179._24_4_;
                    bVar111 = SUB81(uVar87 >> 7,0);
                    auVar189._28_4_ =
                         (uint)bVar111 * auVar180._28_4_ | (uint)!bVar111 * auVar179._28_4_;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar189,auVar231);
                    auVar187 = vfnmsub231ps_avx512vl(auVar187,auVar189,auVar300);
                    auVar265._0_4_ = auVar187._0_4_ * auVar187._0_4_;
                    auVar265._4_4_ = auVar187._4_4_ * auVar187._4_4_;
                    auVar265._8_4_ = auVar187._8_4_ * auVar187._8_4_;
                    auVar265._12_4_ = auVar187._12_4_ * auVar187._12_4_;
                    auVar265._16_4_ = auVar187._16_4_ * auVar187._16_4_;
                    auVar265._20_4_ = auVar187._20_4_ * auVar187._20_4_;
                    auVar265._24_4_ = auVar187._24_4_ * auVar187._24_4_;
                    auVar265._28_4_ = 0;
                    auVar179 = vfmadd213ps_avx512vl(auVar156,auVar187,auVar271);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar276);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar282);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar288);
                    auVar179 = vfmadd213ps_avx512vl(auVar179,auVar187,auVar219);
                    auVar187 = vfmadd213ps_avx512vl(auVar179,auVar265,auVar187);
                    auVar179 = vaddps_avx512vl(auVar187,auVar227);
                    auVar187 = vcvttps2dq_avx512vl(auVar189);
                    auVar187 = vpslld_avx2(auVar187,0x17);
                    auVar187 = vpaddd_avx2(auVar187,auVar294);
                    auVar114 = vfmadd213ps_fma(auVar187,auVar179,auVar227);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar188,2);
                    auVar68._8_4_ = 0x800000;
                    auVar68._0_8_ = 0x80000000800000;
                    auVar68._12_4_ = 0x800000;
                    auVar68._16_4_ = 0x800000;
                    auVar68._20_4_ = 0x800000;
                    auVar68._24_4_ = 0x800000;
                    auVar68._28_4_ = 0x800000;
                    auVar187 = vmaxps_avx512vl(ZEXT1632(auVar114),auVar68);
                    auVar180 = vpsrld_avx2(auVar187,0x17);
                    auVar188 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar69._8_4_ = 0x3f000000;
                    auVar69._0_8_ = 0x3f0000003f000000;
                    auVar69._12_4_ = 0x3f000000;
                    auVar69._16_4_ = 0x3f000000;
                    auVar69._20_4_ = 0x3f000000;
                    auVar69._24_4_ = 0x3f000000;
                    auVar69._28_4_ = 0x3f000000;
                    auVar187 = vpternlogd_avx512vl(auVar187,auVar188,auVar69,0xea);
                    uVar92 = vcmpps_avx512vl(auVar187,auVar157,1);
                    auVar188 = vaddps_avx512vl(auVar187,auVar158);
                    auVar187 = vaddps_avx512vl(auVar188,auVar187);
                    bVar111 = (bool)((byte)uVar92 & 1);
                    auVar190._0_4_ =
                         (uint)bVar111 * auVar187._0_4_ | (uint)!bVar111 * auVar188._0_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar190._4_4_ =
                         (uint)bVar111 * auVar187._4_4_ | (uint)!bVar111 * auVar188._4_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar190._8_4_ =
                         (uint)bVar111 * auVar187._8_4_ | (uint)!bVar111 * auVar188._8_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar190._12_4_ =
                         (uint)bVar111 * auVar187._12_4_ | (uint)!bVar111 * auVar188._12_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar190._16_4_ =
                         (uint)bVar111 * auVar187._16_4_ | (uint)!bVar111 * auVar188._16_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar190._20_4_ =
                         (uint)bVar111 * auVar187._20_4_ | (uint)!bVar111 * auVar188._20_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar190._24_4_ =
                         (uint)bVar111 * auVar187._24_4_ | (uint)!bVar111 * auVar188._24_4_;
                    bVar111 = SUB81(uVar92 >> 7,0);
                    auVar190._28_4_ =
                         (uint)bVar111 * auVar187._28_4_ | (uint)!bVar111 * auVar188._28_4_;
                    auVar188 = vmulps_avx512vl(auVar190,auVar190);
                    auVar187 = vfmadd213ps_avx512vl(auVar159,auVar190,auVar160);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar190,auVar161);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar190,auVar162);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar190,auVar163);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar190,auVar164);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar190,auVar165);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar190,auVar166);
                    auVar187 = vfmadd213ps_avx512vl(auVar187,auVar190,auVar177);
                    auVar179 = vmulps_avx512vl(auVar188,auVar190);
                    auVar179 = vmulps_avx512vl(auVar179,auVar187);
                    auVar70._8_4_ = 0xffffff82;
                    auVar70._0_8_ = 0xffffff82ffffff82;
                    auVar70._12_4_ = 0xffffff82;
                    auVar70._16_4_ = 0xffffff82;
                    auVar70._20_4_ = 0xffffff82;
                    auVar70._24_4_ = 0xffffff82;
                    auVar70._28_4_ = 0xffffff82;
                    auVar187 = vpaddd_avx512vl(auVar180,auVar70);
                    auVar187 = vcvtdq2ps_avx(auVar187);
                    auVar180 = vsubps_avx512vl(auVar187,auVar227);
                    bVar111 = (bool)((byte)uVar92 & 1);
                    auVar191._0_4_ =
                         (uint)bVar111 * auVar180._0_4_ | (uint)!bVar111 * auVar187._0_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar191._4_4_ =
                         (uint)bVar111 * auVar180._4_4_ | (uint)!bVar111 * auVar187._4_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar191._8_4_ =
                         (uint)bVar111 * auVar180._8_4_ | (uint)!bVar111 * auVar187._8_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar191._12_4_ =
                         (uint)bVar111 * auVar180._12_4_ | (uint)!bVar111 * auVar187._12_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar191._16_4_ =
                         (uint)bVar111 * auVar180._16_4_ | (uint)!bVar111 * auVar187._16_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar191._20_4_ =
                         (uint)bVar111 * auVar180._20_4_ | (uint)!bVar111 * auVar187._20_4_;
                    bVar111 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar191._24_4_ =
                         (uint)bVar111 * auVar180._24_4_ | (uint)!bVar111 * auVar187._24_4_;
                    bVar111 = SUB81(uVar92 >> 7,0);
                    auVar191._28_4_ =
                         (uint)bVar111 * auVar180._28_4_ | (uint)!bVar111 * auVar187._28_4_;
                    auVar187 = vfmadd231ps_avx512vl(auVar179,auVar191,auVar300);
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar219,auVar188);
                    auVar187 = vsubps_avx512vl(auVar187,auVar190);
                    auVar114 = vfmsub231ps_fma(auVar187,auVar231,auVar191);
                    auVar187 = vmulps_avx512vl(ZEXT1632(auVar114),auVar178);
                    auVar188 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar111 = (bool)((byte)uVar87 & 1);
                    auVar192._0_4_ =
                         (uint)bVar111 * auVar188._0_4_ | (uint)!bVar111 * auVar187._0_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar192._4_4_ =
                         (uint)bVar111 * auVar188._4_4_ | (uint)!bVar111 * auVar187._4_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar192._8_4_ =
                         (uint)bVar111 * auVar188._8_4_ | (uint)!bVar111 * auVar187._8_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar192._12_4_ =
                         (uint)bVar111 * auVar188._12_4_ | (uint)!bVar111 * auVar187._12_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar192._16_4_ =
                         (uint)bVar111 * auVar188._16_4_ | (uint)!bVar111 * auVar187._16_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar192._20_4_ =
                         (uint)bVar111 * auVar188._20_4_ | (uint)!bVar111 * auVar187._20_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar192._24_4_ =
                         (uint)bVar111 * auVar188._24_4_ | (uint)!bVar111 * auVar187._24_4_;
                    bVar111 = SUB81(uVar87 >> 7,0);
                    auVar192._28_4_ =
                         (uint)bVar111 * auVar188._28_4_ | (uint)!bVar111 * auVar187._28_4_;
                    auVar187 = vminps_avx(auVar192,auVar210);
                    auVar187 = vmaxps_avx(auVar187,auVar215);
                    auVar114 = vfmadd213ps_fma(auVar223,auVar187,auVar219);
                    auVar188 = vrndscaleps_avx512vl(ZEXT1632(auVar114),1);
                    uVar87 = vcmpps_avx512vl(ZEXT1632(auVar114),auVar188,1);
                    auVar179 = vsubps_avx512vl(auVar188,auVar227);
                    bVar111 = (bool)((byte)uVar87 & 1);
                    auVar193._0_4_ =
                         (uint)bVar111 * auVar179._0_4_ | (uint)!bVar111 * auVar188._0_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 1) & 1);
                    auVar193._4_4_ =
                         (uint)bVar111 * auVar179._4_4_ | (uint)!bVar111 * auVar188._4_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 2) & 1);
                    auVar193._8_4_ =
                         (uint)bVar111 * auVar179._8_4_ | (uint)!bVar111 * auVar188._8_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 3) & 1);
                    auVar193._12_4_ =
                         (uint)bVar111 * auVar179._12_4_ | (uint)!bVar111 * auVar188._12_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 4) & 1);
                    auVar193._16_4_ =
                         (uint)bVar111 * auVar179._16_4_ | (uint)!bVar111 * auVar188._16_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 5) & 1);
                    auVar193._20_4_ =
                         (uint)bVar111 * auVar179._20_4_ | (uint)!bVar111 * auVar188._20_4_;
                    bVar111 = (bool)((byte)(uVar87 >> 6) & 1);
                    auVar193._24_4_ =
                         (uint)bVar111 * auVar179._24_4_ | (uint)!bVar111 * auVar188._24_4_;
                    bVar111 = SUB81(uVar87 >> 7,0);
                    auVar193._28_4_ =
                         (uint)bVar111 * auVar179._28_4_ | (uint)!bVar111 * auVar188._28_4_;
                    auVar187 = vfmsub231ps_avx512vl(auVar187,auVar193,auVar231);
                    auVar187 = vfnmsub231ps_avx512vl(auVar187,auVar193,auVar300);
                    auVar266._0_4_ = auVar187._0_4_ * auVar187._0_4_;
                    auVar266._4_4_ = auVar187._4_4_ * auVar187._4_4_;
                    auVar266._8_4_ = auVar187._8_4_ * auVar187._8_4_;
                    auVar266._12_4_ = auVar187._12_4_ * auVar187._12_4_;
                    auVar266._16_4_ = auVar187._16_4_ * auVar187._16_4_;
                    auVar266._20_4_ = auVar187._20_4_ * auVar187._20_4_;
                    auVar266._24_4_ = auVar187._24_4_ * auVar187._24_4_;
                    auVar266._28_4_ = 0;
                    auVar188 = vfmadd213ps_avx512vl(auVar156,auVar187,auVar271);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar276);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar282);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar288);
                    auVar188 = vfmadd213ps_avx512vl(auVar188,auVar187,auVar219);
                    auVar187 = vfmadd213ps_avx512vl(auVar188,auVar266,auVar187);
                    auVar188 = vaddps_avx512vl(auVar187,auVar227);
                    auVar187 = vcvttps2dq_avx512vl(auVar193);
                    auVar187 = vpslld_avx2(auVar187,0x17);
                    auVar187 = vpaddd_avx2(auVar187,auVar294);
                    auVar114 = vfmadd213ps_fma(auVar187,auVar188,auVar227);
                    auVar187 = vrcpps_avx(ZEXT1632(auVar114));
                    auVar114 = vfmsub213ps_fma(ZEXT1632(auVar114),auVar187,auVar227);
                    auVar114 = vfnmadd132ps_fma(ZEXT1632(auVar114),auVar187,auVar187);
                    auVar187 = vfnmadd213ps_avx512vl(ZEXT1632(auVar114),auVar178,auVar158);
                    auVar205._0_4_ = auVar187._0_4_ * auVar200._0_4_;
                    auVar205._4_4_ = auVar187._4_4_ * auVar200._4_4_;
                    auVar205._8_4_ = auVar187._8_4_ * auVar200._8_4_;
                    auVar205._12_4_ = auVar187._12_4_ * auVar200._12_4_;
                    auVar205._16_4_ = auVar187._16_4_ * auVar200._16_4_;
                    auVar205._20_4_ = auVar187._20_4_ * auVar200._20_4_;
                    auVar205._24_4_ = auVar187._24_4_ * auVar200._24_4_;
                    auVar187 = auVar205._0_32_;
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                    auVar251._4_4_ = uVar1;
                    auVar251._0_4_ = uVar1;
                    auVar251._8_4_ = uVar1;
                    auVar251._12_4_ = uVar1;
                    auVar251._16_4_ = uVar1;
                    auVar251._20_4_ = uVar1;
                    auVar251._24_4_ = uVar1;
                    auVar251._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar67._4_4_ = uVar1;
                    auVar67._0_4_ = uVar1;
                    auVar67._8_4_ = uVar1;
                    auVar67._12_4_ = uVar1;
                    auVar67._16_4_ = uVar1;
                    auVar67._20_4_ = uVar1;
                    auVar67._24_4_ = uVar1;
                    auVar67._28_4_ = uVar1;
                    auVar187 = vfmadd213ps_avx512vl(auVar251,auVar187,auVar67);
                    auVar187 = vmaxps_avx(auVar187,auVar188);
                    auVar187 = vminps_avx(auVar187,auVar227);
                    auVar206._0_4_ = auVar187._0_4_ * auVar200._0_4_;
                    auVar206._4_4_ = auVar187._4_4_ * auVar200._4_4_;
                    auVar206._8_4_ = auVar187._8_4_ * auVar200._8_4_;
                    auVar206._12_4_ = auVar187._12_4_ * auVar200._12_4_;
                    auVar206._16_4_ = auVar187._16_4_ * auVar200._16_4_;
                    auVar206._20_4_ = auVar187._20_4_ * auVar200._20_4_;
                    auVar206._24_4_ = auVar187._24_4_ * auVar200._24_4_;
                    auVar206._28_36_ = auVar205._28_36_;
                    auVar187 = auVar206._0_32_;
                  }
                }
                *pauVar91 = auVar187;
                pauVar91 = pauVar91 + 1;
                iVar86 = iVar86 + 4;
                bVar111 = iVar105 != iVar5;
                iVar105 = iVar105 + 1;
              } while (bVar111);
            }
            local_160 = local_160 + 1;
          } while (local_160 != uVar79);
        }
        bVar111 = 0 < (int)uVar79;
        bVar109 = iVar99 == 1;
        if (iVar4 == 8 && (bVar109 && bVar111)) {
          local_88 = (long)top_blob->w * top_blob->elemsize;
          local_90 = top_blob->data;
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_98 = (this->weight_data_packed).data;
          local_a0 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
          local_80 = (ulong)uVar79;
          local_138 = 0;
          do {
            pvVar77 = local_90;
            pvVar11 = local_e8.data;
            if (-1 < iVar5) {
              lVar82 = local_88 * local_138;
              pauVar91 = (undefined1 (*) [32])(local_a0 * local_138 + (long)local_98);
              lVar84 = (long)local_e8.w;
              lVar90 = CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize);
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar105 = 0;
              uVar87 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  fVar196 = 0.0;
                }
                else {
                  fVar196 = *(float *)(*(long *)(&this->field_0x190 + (long)p_Var6) + local_138 * 4)
                  ;
                }
                if (iVar78 < 1) {
                  auVar156 = SUB6432(ZEXT864(0),0);
                }
                else {
                  p_Var9 = pp_Var8[-3];
                  iVar86 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  pauVar107 = (undefined1 (*) [32])
                              ((long)pvVar11 +
                              (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar105) * 4);
                  auVar200 = ZEXT864(0);
                  uVar92 = 0;
                  pauVar80 = pauVar91;
                  do {
                    if (0 < iVar86) {
                      pauVar88 = pauVar107;
                      pauVar96 = pauVar80;
                      iVar85 = iVar86;
                      do {
                        auVar114 = vfmadd231ps_fma(auVar200._0_32_,*pauVar96,*pauVar88);
                        auVar200 = ZEXT1664(auVar114);
                        pauVar96 = pauVar96 + 1;
                        pauVar88 = (undefined1 (*) [32])
                                   (*pauVar88 +
                                   (long)(*(int *)(&this->field_0xd8 + (long)p_Var9) << 3) * 4);
                        iVar85 = iVar85 + -1;
                      } while (iVar85 != 0);
                      pauVar80 = pauVar80 + (ulong)(iVar86 - 1) + 1;
                    }
                    auVar156 = auVar200._0_32_;
                    uVar92 = uVar92 + 1;
                    pauVar107 = (undefined1 (*) [32])(*pauVar107 + lVar84 * lVar90);
                  } while (uVar92 != uVar104);
                }
                auVar115._0_4_ = auVar156._16_4_ + auVar156._0_4_;
                auVar115._4_4_ = auVar156._20_4_ + auVar156._4_4_;
                auVar115._8_4_ = auVar156._24_4_ + auVar156._8_4_;
                auVar115._12_4_ = auVar156._28_4_ + auVar156._12_4_;
                auVar114 = vshufpd_avx(auVar115,auVar115,1);
                auVar116._0_4_ = auVar114._0_4_ + auVar115._0_4_;
                auVar116._4_4_ = auVar114._4_4_ + auVar115._4_4_;
                auVar116._8_4_ = auVar114._8_4_ + auVar115._8_4_;
                auVar116._12_4_ = auVar114._12_4_ + auVar115._12_4_;
                auVar114 = vmovshdup_avx(auVar116);
                fVar196 = auVar114._0_4_ + fVar196 + auVar116._0_4_;
                auVar114 = ZEXT416((uint)fVar196);
                fVar195 = fVar196;
                if (*(int *)(&this->field_0xf4 + (long)p_Var6) - 1U < 6) {
                  switch(*(int *)(&this->field_0xf4 + (long)p_Var6)) {
                  case 1:
                    auVar114 = vmaxss_avx(ZEXT416((uint)fVar196),ZEXT416(0));
                    fVar195 = auVar114._0_4_;
                    break;
                  case 2:
                    uVar12 = vcmpss_avx512f(ZEXT416((uint)fVar196),ZEXT416(0),0xe);
                    bVar110 = (bool)((byte)uVar12 & 1);
                    fVar195 = (float)((uint)bVar110 * 0x3f800000 +
                                     (uint)!bVar110 * **(int **)(&this->field_0xf8 + (long)p_Var6))
                              * fVar196;
                    break;
                  case 3:
                    fVar196 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                    auVar114 = vmaxss_avx(auVar114,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                      (long)p_Var6)));
                    fVar195 = auVar114._0_4_;
                    if (fVar196 < auVar114._0_4_) {
                      fVar195 = fVar196;
                    }
                    break;
                  case 4:
                    auVar114 = vminss_avx(auVar114,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar118._8_4_ = 0x80000000;
                    auVar118._0_8_ = 0x8000000080000000;
                    auVar118._12_4_ = 0x80000000;
                    auVar115 = vxorps_avx512vl(auVar114,auVar118);
                    uVar12 = vcmpss_avx512f(auVar114,ZEXT416(0xc2b0c0a5),1);
                    bVar110 = (bool)((byte)uVar12 & 1);
                    fVar196 = expf((float)((uint)bVar110 * 0x42b0c0a5 +
                                          (uint)!bVar110 * auVar115._0_4_));
                    fVar195 = 1.0 / (fVar196 + 1.0);
                    break;
                  case 5:
                    fVar195 = expf(fVar196);
                    fVar195 = logf(fVar195 + 1.0);
                    fVar195 = tanhf(fVar195);
                    fVar195 = fVar195 * fVar196;
                    break;
                  case 6:
                    fVar3 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                    auVar117._8_4_ = 0x80000000;
                    auVar117._0_8_ = 0x8000000080000000;
                    auVar117._12_4_ = 0x80000000;
                    auVar116 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var6))[1]);
                    auVar115 = vxorps_avx512vl(auVar116,auVar117);
                    fVar211 = auVar115._0_4_ / fVar3;
                    fVar195 = 0.0;
                    if ((fVar211 <= fVar196) &&
                       (fVar195 = fVar196, fVar196 <= fVar211 + 1.0 / fVar3)) {
                      auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar114,auVar116);
                      fVar195 = auVar114._0_4_ * fVar196;
                    }
                  }
                }
                *(float *)((long)pvVar77 + uVar87 * 4 + lVar82) = fVar195;
                uVar87 = uVar87 + 1;
                iVar105 = iVar105 + 8;
              } while (uVar87 != _w);
            }
            local_138 = local_138 + 1;
          } while (local_138 != local_80);
        }
        bVar110 = 0 < (int)uVar79;
        bVar112 = iVar99 == 4;
        if (iVar4 == 8 && (bVar112 && bVar110)) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_160 = 0;
          auVar137 = ZEXT816(0) << 0x40;
          auVar138._8_4_ = 0x42b0c0a5;
          auVar138._0_8_ = 0x42b0c0a542b0c0a5;
          auVar138._12_4_ = 0x42b0c0a5;
          auVar139._8_4_ = 0xc2b0c0a5;
          auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar139._12_4_ = 0xc2b0c0a5;
          auVar197._8_4_ = 0x3f000000;
          auVar197._0_8_ = 0x3f0000003f000000;
          auVar197._12_4_ = 0x3f000000;
          auVar140._8_4_ = 0x3fb8aa3b;
          auVar140._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar140._12_4_ = 0x3fb8aa3b;
          auVar149._8_4_ = 0x3f800000;
          auVar149._0_8_ = 0x3f8000003f800000;
          auVar149._12_4_ = 0x3f800000;
          auVar142._8_4_ = 0x3f318000;
          auVar142._0_8_ = 0x3f3180003f318000;
          auVar142._12_4_ = 0x3f318000;
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar141._8_4_ = 0x3ab743ce;
          auVar141._0_8_ = 0x3ab743ce3ab743ce;
          auVar141._12_4_ = 0x3ab743ce;
          auVar256._8_4_ = 0x3c088908;
          auVar256._0_8_ = 0x3c0889083c088908;
          auVar256._12_4_ = 0x3c088908;
          auVar277._8_4_ = 0x3d2aa9c1;
          auVar277._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar277._12_4_ = 0x3d2aa9c1;
          auVar283._8_4_ = 0x3e2aaaaa;
          auVar283._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar283._12_4_ = 0x3e2aaaaa;
          auVar289._8_4_ = 0x3f800000;
          auVar289._0_8_ = 0x3f8000003f800000;
          auVar289._12_4_ = 0x3f800000;
          auVar295._8_4_ = 0xb95e8083;
          auVar295._0_8_ = 0xb95e8083b95e8083;
          auVar295._12_4_ = 0xb95e8083;
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < iVar5) {
              pauVar93 = (undefined1 (*) [16])
                         ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar86 = 0;
              iVar105 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar130 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar130 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x190 + (long)p_Var6) + local_160 * 0x10);
                }
                auVar200 = ZEXT1664(auVar130);
                if (0 < iVar78) {
                  pauVar108 = (undefined1 (*) [16])
                              ((this->weight_data_packed).cstep * local_160 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var9 = pp_Var8[-3];
                  iVar99 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  puVar100 = (uint *)((long)local_e8.data +
                                     (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar86) * 4
                                     + 0x1c);
                  uVar87 = 0;
                  do {
                    if (0 < iVar99) {
                      puVar95 = puVar100;
                      pauVar81 = pauVar108;
                      iVar85 = iVar99;
                      do {
                        uVar2 = puVar95[-7];
                        auVar130._4_4_ = uVar2;
                        auVar130._0_4_ = uVar2;
                        auVar130._8_4_ = uVar2;
                        auVar130._12_4_ = uVar2;
                        uVar2 = puVar95[-6];
                        auVar252._4_4_ = uVar2;
                        auVar252._0_4_ = uVar2;
                        auVar252._8_4_ = uVar2;
                        auVar252._12_4_ = uVar2;
                        auVar124 = vbroadcastss_avx512vl(ZEXT416(puVar95[-5]));
                        auVar125 = vbroadcastss_avx512vl(ZEXT416(puVar95[-4]));
                        auVar126 = vbroadcastss_avx512vl(ZEXT416(puVar95[-3]));
                        auVar127 = vbroadcastss_avx512vl(ZEXT416(puVar95[-2]));
                        auVar128 = vbroadcastss_avx512vl(ZEXT416(puVar95[-1]));
                        auVar129 = vbroadcastss_avx512vl(ZEXT416(*puVar95));
                        auVar130 = vfmadd132ps_fma(auVar130,auVar200._0_16_,*pauVar81);
                        auVar130 = vfmadd231ps_fma(auVar130,auVar252,pauVar81[1]);
                        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar124,pauVar81[2]);
                        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar125,pauVar81[3]);
                        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar126,pauVar81[4]);
                        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar127,pauVar81[5]);
                        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar128,pauVar81[6]);
                        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar129,pauVar81[7]);
                        auVar200 = ZEXT1664(auVar130);
                        pauVar81 = pauVar81 + 8;
                        puVar95 = puVar95 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 3);
                        iVar85 = iVar85 + -1;
                      } while (iVar85 != 0);
                      pauVar108 = pauVar108 + (ulong)(iVar99 - 1) * 8 + 8;
                    }
                    auVar130 = auVar200._0_16_;
                    uVar87 = uVar87 + 1;
                    puVar100 = (uint *)((long)puVar100 +
                                       (long)local_e8.w *
                                       CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize));
                  } while (uVar87 != uVar104);
                }
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar130 = vmaxps_avx(auVar130,auVar137);
                  break;
                case 2:
                  auVar124 = vmaxps_avx(auVar130,auVar137);
                  auVar130 = vminps_avx(auVar130,auVar137);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar24._4_4_ = uVar1;
                  auVar24._0_4_ = uVar1;
                  auVar24._8_4_ = uVar1;
                  auVar24._12_4_ = uVar1;
                  auVar130 = vfmadd132ps_avx512vl(auVar130,auVar124,auVar24);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar22._4_4_ = uVar1;
                  auVar22._0_4_ = uVar1;
                  auVar22._8_4_ = uVar1;
                  auVar22._12_4_ = uVar1;
                  auVar130 = vmaxps_avx512vl(auVar130,auVar22);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar23._4_4_ = uVar1;
                  auVar23._0_4_ = uVar1;
                  auVar23._8_4_ = uVar1;
                  auVar23._12_4_ = uVar1;
                  auVar130 = vminps_avx512vl(auVar130,auVar23);
                  break;
                case 4:
                  auVar20._8_4_ = 0x80000000;
                  auVar20._0_8_ = 0x8000000080000000;
                  auVar20._12_4_ = 0x80000000;
                  auVar130 = vxorps_avx512vl(auVar130,auVar20);
                  auVar130 = vminps_avx(auVar130,auVar138);
                  auVar130 = vmaxps_avx(auVar130,auVar139);
                  auVar124 = vfmadd231ps_fma(auVar197,auVar130,auVar140);
                  auVar125 = vcvttps2dq_avx512vl(auVar124);
                  auVar125 = vcvtdq2ps_avx512vl(auVar125);
                  uVar87 = vcmpps_avx512vl(auVar124,auVar125,1);
                  auVar124 = vsubps_avx512vl(auVar125,auVar149);
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar136._0_4_ = (uint)bVar113 * auVar124._0_4_ | (uint)!bVar113 * auVar125._0_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar136._4_4_ = (uint)bVar113 * auVar124._4_4_ | (uint)!bVar113 * auVar125._4_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar136._8_4_ = (uint)bVar113 * auVar124._8_4_ | (uint)!bVar113 * auVar125._8_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar136._12_4_ =
                       (uint)bVar113 * auVar124._12_4_ | (uint)!bVar113 * auVar125._12_4_;
                  auVar130 = vfmsub231ps_avx512vl(auVar130,auVar136,auVar142);
                  auVar21._8_4_ = 0x395e8083;
                  auVar21._0_8_ = 0x395e8083395e8083;
                  auVar21._12_4_ = 0x395e8083;
                  auVar124 = vfmsub231ps_avx512vl(auVar130,auVar136,auVar21);
                  auVar232._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                  auVar232._4_4_ = auVar124._4_4_ * auVar124._4_4_;
                  auVar232._8_4_ = auVar124._8_4_ * auVar124._8_4_;
                  auVar232._12_4_ = auVar124._12_4_ * auVar124._12_4_;
                  auVar130 = vfmadd213ps_fma(auVar114,auVar124,auVar141);
                  auVar130 = vfmadd213ps_fma(auVar130,auVar124,auVar256);
                  auVar130 = vfmadd213ps_fma(auVar130,auVar124,auVar277);
                  auVar130 = vfmadd213ps_fma(auVar130,auVar124,auVar283);
                  auVar130 = vfmadd213ps_fma(auVar130,auVar124,auVar197);
                  auVar130 = vfmadd213ps_fma(auVar130,auVar232,auVar124);
                  auVar233._0_4_ = auVar130._0_4_ + 1.0;
                  auVar233._4_4_ = auVar130._4_4_ + 1.0;
                  auVar233._8_4_ = auVar130._8_4_ + 1.0;
                  auVar233._12_4_ = auVar130._12_4_ + 1.0;
                  auVar130 = vcvttps2dq_avx512vl(auVar136);
                  auVar130 = vpslld_avx(auVar130,0x17);
                  auVar130 = vpaddd_avx(auVar289,auVar130);
                  auVar124 = vfmadd213ps_fma(auVar130,auVar233,auVar149);
                  auVar130 = vrcpps_avx(auVar124);
                  auVar124 = vfmsub213ps_fma(auVar124,auVar130,auVar149);
                  auVar130 = vfnmadd132ps_fma(auVar124,auVar130,auVar130);
                  break;
                case 5:
                  auVar124 = vminps_avx(auVar130,auVar138);
                  auVar124 = vmaxps_avx(auVar124,auVar139);
                  auVar125 = vfmadd213ps_fma(auVar140,auVar124,auVar197);
                  auVar126 = vcvttps2dq_avx512vl(auVar125);
                  auVar126 = vcvtdq2ps_avx512vl(auVar126);
                  uVar87 = vcmpps_avx512vl(auVar125,auVar126,1);
                  auVar125 = vsubps_avx512vl(auVar126,auVar149);
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar131._0_4_ = (uint)bVar113 * auVar125._0_4_ | (uint)!bVar113 * auVar126._0_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar131._4_4_ = (uint)bVar113 * auVar125._4_4_ | (uint)!bVar113 * auVar126._4_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar131._8_4_ = (uint)bVar113 * auVar125._8_4_ | (uint)!bVar113 * auVar126._8_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar113 * auVar125._12_4_ | (uint)!bVar113 * auVar126._12_4_;
                  auVar124 = vfmsub231ps_avx512vl(auVar124,auVar131,auVar142);
                  auVar124 = vfnmsub231ps_avx512vl(auVar124,auVar131,auVar295);
                  auVar253._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                  auVar253._4_4_ = auVar124._4_4_ * auVar124._4_4_;
                  auVar253._8_4_ = auVar124._8_4_ * auVar124._8_4_;
                  auVar253._12_4_ = auVar124._12_4_ * auVar124._12_4_;
                  auVar125 = vfmadd213ps_avx512vl(auVar114,auVar124,auVar141);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar256);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar277);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar283);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar197);
                  auVar124 = vfmadd213ps_avx512vl(auVar125,auVar253,auVar124);
                  auVar125 = vaddps_avx512vl(auVar124,auVar149);
                  auVar124 = vcvttps2dq_avx512vl(auVar131);
                  auVar124 = vpslld_avx(auVar124,0x17);
                  auVar124 = vpaddd_avx(auVar124,auVar289);
                  auVar124 = vfmadd213ps_fma(auVar124,auVar125,auVar149);
                  uVar87 = vcmpps_avx512vl(auVar124,auVar137,2);
                  auVar127._8_4_ = 0x800000;
                  auVar127._0_8_ = 0x80000000800000;
                  auVar127._12_4_ = 0x800000;
                  auVar124 = vmaxps_avx512vl(auVar124,auVar127);
                  auVar127 = vpsrld_avx(auVar124,0x17);
                  auVar125 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar128._8_4_ = 0x3f000000;
                  auVar128._0_8_ = 0x3f0000003f000000;
                  auVar128._12_4_ = 0x3f000000;
                  auVar124 = vpternlogd_avx512vl(auVar124,auVar125,auVar128,0xea);
                  auVar129._8_4_ = 0x3f3504f3;
                  auVar129._0_8_ = 0x3f3504f33f3504f3;
                  auVar129._12_4_ = 0x3f3504f3;
                  uVar92 = vcmpps_avx512vl(auVar124,auVar129,1);
                  auVar17._8_4_ = 0xbf800000;
                  auVar17._0_8_ = 0xbf800000bf800000;
                  auVar17._12_4_ = 0xbf800000;
                  auVar125 = vaddps_avx512vl(auVar124,auVar17);
                  auVar124 = vaddps_avx512vl(auVar125,auVar124);
                  bVar113 = (bool)((byte)uVar92 & 1);
                  auVar132._0_4_ = (uint)bVar113 * auVar124._0_4_ | (uint)!bVar113 * auVar125._0_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 1) & 1);
                  auVar132._4_4_ = (uint)bVar113 * auVar124._4_4_ | (uint)!bVar113 * auVar125._4_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 2) & 1);
                  auVar132._8_4_ = (uint)bVar113 * auVar124._8_4_ | (uint)!bVar113 * auVar125._8_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 3) & 1);
                  auVar132._12_4_ =
                       (uint)bVar113 * auVar124._12_4_ | (uint)!bVar113 * auVar125._12_4_;
                  auVar125 = vmulps_avx512vl(auVar132,auVar132);
                  auVar18._8_4_ = 0xbdebd1b8;
                  auVar18._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar18._12_4_ = 0xbdebd1b8;
                  auVar124 = vfmadd213ps_avx512vl(auVar115,auVar132,auVar18);
                  auVar124 = vfmadd213ps_avx512vl(auVar124,auVar132,auVar116);
                  auVar124 = vfmadd213ps_avx512vl(auVar124,auVar132,auVar117);
                  auVar124 = vfmadd213ps_avx512vl(auVar124,auVar132,auVar118);
                  auVar124 = vfmadd213ps_avx512vl(auVar124,auVar132,auVar119);
                  auVar124 = vfmadd213ps_avx512vl(auVar124,auVar132,auVar120);
                  auVar124 = vfmadd213ps_avx512vl(auVar124,auVar132,auVar121);
                  auVar124 = vfmadd213ps_avx512vl(auVar124,auVar132,auVar122);
                  auVar126 = vmulps_avx512vl(auVar125,auVar132);
                  auVar126 = vmulps_avx512vl(auVar126,auVar124);
                  auVar19._8_4_ = 0xffffff82;
                  auVar19._0_8_ = 0xffffff82ffffff82;
                  auVar19._12_4_ = 0xffffff82;
                  auVar124 = vpaddd_avx512vl(auVar127,auVar19);
                  auVar124 = vcvtdq2ps_avx(auVar124);
                  auVar127 = vsubps_avx512vl(auVar124,auVar149);
                  bVar113 = (bool)((byte)uVar92 & 1);
                  auVar133._0_4_ = (uint)bVar113 * auVar127._0_4_ | (uint)!bVar113 * auVar124._0_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 1) & 1);
                  auVar133._4_4_ = (uint)bVar113 * auVar127._4_4_ | (uint)!bVar113 * auVar124._4_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 2) & 1);
                  auVar133._8_4_ = (uint)bVar113 * auVar127._8_4_ | (uint)!bVar113 * auVar124._8_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 3) & 1);
                  auVar133._12_4_ =
                       (uint)bVar113 * auVar127._12_4_ | (uint)!bVar113 * auVar124._12_4_;
                  auVar124 = vfmadd231ps_avx512vl(auVar126,auVar133,auVar295);
                  auVar124 = vfmsub231ps_avx512vl(auVar124,auVar197,auVar125);
                  auVar124 = vsubps_avx512vl(auVar124,auVar132);
                  auVar124 = vfnmadd231ps_fma(auVar124,auVar142,auVar133);
                  auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar134._0_4_ =
                       (uint)bVar113 * auVar125._0_4_ |
                       (uint)!bVar113 * (int)(auVar124._0_4_ + auVar124._0_4_);
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar134._4_4_ =
                       (uint)bVar113 * auVar125._4_4_ |
                       (uint)!bVar113 * (int)(auVar124._4_4_ + auVar124._4_4_);
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar134._8_4_ =
                       (uint)bVar113 * auVar125._8_4_ |
                       (uint)!bVar113 * (int)(auVar124._8_4_ + auVar124._8_4_);
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar134._12_4_ =
                       (uint)bVar113 * auVar125._12_4_ |
                       (uint)!bVar113 * (int)(auVar124._12_4_ + auVar124._12_4_);
                  auVar124 = vminps_avx(auVar134,auVar138);
                  auVar124 = vmaxps_avx(auVar124,auVar139);
                  auVar125 = vfmadd213ps_fma(auVar140,auVar124,auVar197);
                  auVar126 = vcvttps2dq_avx512vl(auVar125);
                  auVar126 = vcvtdq2ps_avx512vl(auVar126);
                  uVar87 = vcmpps_avx512vl(auVar125,auVar126,1);
                  auVar125 = vsubps_avx512vl(auVar126,auVar149);
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar135._0_4_ = (uint)bVar113 * auVar125._0_4_ | (uint)!bVar113 * auVar126._0_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar135._4_4_ = (uint)bVar113 * auVar125._4_4_ | (uint)!bVar113 * auVar126._4_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar135._8_4_ = (uint)bVar113 * auVar125._8_4_ | (uint)!bVar113 * auVar126._8_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar135._12_4_ =
                       (uint)bVar113 * auVar125._12_4_ | (uint)!bVar113 * auVar126._12_4_;
                  auVar124 = vfmsub231ps_avx512vl(auVar124,auVar135,auVar142);
                  auVar124 = vfnmsub231ps_avx512vl(auVar124,auVar135,auVar295);
                  auVar254._0_4_ = auVar124._0_4_ * auVar124._0_4_;
                  auVar254._4_4_ = auVar124._4_4_ * auVar124._4_4_;
                  auVar254._8_4_ = auVar124._8_4_ * auVar124._8_4_;
                  auVar254._12_4_ = auVar124._12_4_ * auVar124._12_4_;
                  auVar125 = vfmadd213ps_avx512vl(auVar114,auVar124,auVar141);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar256);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar277);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar283);
                  auVar125 = vfmadd213ps_avx512vl(auVar125,auVar124,auVar197);
                  auVar124 = vfmadd213ps_avx512vl(auVar125,auVar254,auVar124);
                  auVar125 = vaddps_avx512vl(auVar124,auVar149);
                  auVar124 = vcvttps2dq_avx512vl(auVar135);
                  auVar124 = vpslld_avx(auVar124,0x17);
                  auVar124 = vpaddd_avx(auVar124,auVar289);
                  auVar125 = vfmadd213ps_fma(auVar124,auVar125,auVar149);
                  auVar124 = vrcpps_avx(auVar125);
                  auVar126 = vaddps_avx512vl(auVar124,auVar124);
                  auVar125 = vfmsub213ps_avx512vl(auVar125,auVar126,auVar123);
                  auVar124 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar126);
                  auVar130 = vfmsub231ps_fma(auVar130,auVar130,auVar124);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar126._4_4_ = uVar1;
                  auVar126._0_4_ = uVar1;
                  auVar126._8_4_ = uVar1;
                  auVar126._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar124._4_4_ = uVar1;
                  auVar124._0_4_ = uVar1;
                  auVar124._8_4_ = uVar1;
                  auVar124._12_4_ = uVar1;
                  auVar124 = vfmadd213ps_avx512vl(auVar126,auVar130,auVar124);
                  auVar124 = vmaxps_avx(auVar124,auVar137);
                  auVar124 = vminps_avx(auVar124,auVar149);
                  auVar125._0_4_ = auVar124._0_4_ * auVar130._0_4_;
                  auVar125._4_4_ = auVar124._4_4_ * auVar130._4_4_;
                  auVar125._8_4_ = auVar124._8_4_ * auVar130._8_4_;
                  auVar125._12_4_ = auVar124._12_4_ * auVar130._12_4_;
                  auVar130 = auVar125;
                }
                *pauVar93 = auVar130;
                pauVar93 = pauVar93 + 1;
                iVar86 = iVar86 + 8;
                bVar113 = iVar105 != iVar5;
                iVar105 = iVar105 + 1;
              } while (bVar113);
            }
            local_160 = local_160 + 1;
          } while (local_160 != uVar79);
        }
        if (iVar4 == 4 && (bVar112 && bVar110)) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_160 = 0;
          auVar197 = ZEXT816(0) << 0x40;
          auVar207._8_4_ = 0x42b0c0a5;
          auVar207._0_8_ = 0x42b0c0a542b0c0a5;
          auVar207._12_4_ = 0x42b0c0a5;
          auVar212._8_4_ = 0xc2b0c0a5;
          auVar212._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar212._12_4_ = 0xc2b0c0a5;
          auVar216._8_4_ = 0x3f000000;
          auVar216._0_8_ = 0x3f0000003f000000;
          auVar216._12_4_ = 0x3f000000;
          auVar220._8_4_ = 0x3fb8aa3b;
          auVar220._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar220._12_4_ = 0x3fb8aa3b;
          auVar224._8_4_ = 0x3f800000;
          auVar224._0_8_ = 0x3f8000003f800000;
          auVar224._12_4_ = 0x3f800000;
          auVar228._8_4_ = 0x3f318000;
          auVar228._0_8_ = 0x3f3180003f318000;
          auVar228._12_4_ = 0x3f318000;
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar267._8_4_ = 0x3ab743ce;
          auVar267._0_8_ = 0x3ab743ce3ab743ce;
          auVar267._12_4_ = 0x3ab743ce;
          auVar272._8_4_ = 0x3c088908;
          auVar272._0_8_ = 0x3c0889083c088908;
          auVar272._12_4_ = 0x3c088908;
          auVar278._8_4_ = 0x3d2aa9c1;
          auVar278._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar278._12_4_ = 0x3d2aa9c1;
          auVar284._8_4_ = 0x3e2aaaaa;
          auVar284._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar284._12_4_ = 0x3e2aaaaa;
          auVar290._8_4_ = 0x3f800000;
          auVar290._0_8_ = 0x3f8000003f800000;
          auVar290._12_4_ = 0x3f800000;
          auVar296._8_4_ = 0xb95e8083;
          auVar296._0_8_ = 0xb95e8083b95e8083;
          auVar296._12_4_ = 0xb95e8083;
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar137 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar139 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < iVar5) {
              pauVar93 = (undefined1 (*) [16])
                         ((long)top_blob->w * local_160 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar86 = 0;
              iVar105 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar140 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar140 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x190 + (long)p_Var6) + local_160 * 0x10);
                }
                auVar200 = ZEXT1664(auVar140);
                if (0 < iVar78) {
                  pauVar108 = (undefined1 (*) [16])
                              ((this->weight_data_packed).cstep * local_160 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var9 = pp_Var8[-3];
                  iVar99 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  puVar101 = (undefined4 *)
                             ((long)local_e8.data +
                             (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar86) * 4 + 0xc);
                  uVar87 = 0;
                  do {
                    if (0 < iVar99) {
                      pauVar81 = pauVar108;
                      puVar94 = puVar101;
                      iVar85 = iVar99;
                      do {
                        uVar1 = puVar94[-3];
                        auVar13._4_4_ = uVar1;
                        auVar13._0_4_ = uVar1;
                        auVar13._8_4_ = uVar1;
                        auVar13._12_4_ = uVar1;
                        auVar140 = vfmadd132ps_avx512vl(*pauVar81,auVar200._0_16_,auVar13);
                        uVar1 = puVar94[-2];
                        auVar14._4_4_ = uVar1;
                        auVar14._0_4_ = uVar1;
                        auVar14._8_4_ = uVar1;
                        auVar14._12_4_ = uVar1;
                        auVar140 = vfmadd231ps_avx512vl(auVar140,pauVar81[1],auVar14);
                        uVar1 = puVar94[-1];
                        auVar15._4_4_ = uVar1;
                        auVar15._0_4_ = uVar1;
                        auVar15._8_4_ = uVar1;
                        auVar15._12_4_ = uVar1;
                        auVar140 = vfmadd231ps_avx512vl(auVar140,pauVar81[2],auVar15);
                        uVar1 = *puVar94;
                        auVar16._4_4_ = uVar1;
                        auVar16._0_4_ = uVar1;
                        auVar16._8_4_ = uVar1;
                        auVar16._12_4_ = uVar1;
                        auVar140 = vfmadd231ps_avx512vl(auVar140,pauVar81[3],auVar16);
                        auVar200 = ZEXT1664(auVar140);
                        pauVar81 = pauVar81 + 4;
                        puVar94 = puVar94 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 2);
                        iVar85 = iVar85 + -1;
                      } while (iVar85 != 0);
                      pauVar108 = pauVar108 + (ulong)(iVar99 - 1) * 4 + 4;
                    }
                    auVar140 = auVar200._0_16_;
                    uVar87 = uVar87 + 1;
                    puVar101 = (undefined4 *)
                               ((long)puVar101 +
                               (long)local_e8.w *
                               CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize));
                  } while (uVar87 != uVar104);
                }
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar140 = vmaxps_avx(auVar140,auVar197);
                  break;
                case 2:
                  auVar149 = vmaxps_avx(auVar140,auVar197);
                  auVar140 = vminps_avx(auVar140,auVar197);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar140 = vfmadd132ps_avx512vl(auVar140,auVar149,auVar33);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar31._4_4_ = uVar1;
                  auVar31._0_4_ = uVar1;
                  auVar31._8_4_ = uVar1;
                  auVar31._12_4_ = uVar1;
                  auVar140 = vmaxps_avx512vl(auVar140,auVar31);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar32._4_4_ = uVar1;
                  auVar32._0_4_ = uVar1;
                  auVar32._8_4_ = uVar1;
                  auVar32._12_4_ = uVar1;
                  auVar140 = vminps_avx512vl(auVar140,auVar32);
                  break;
                case 4:
                  auVar29._8_4_ = 0x80000000;
                  auVar29._0_8_ = 0x8000000080000000;
                  auVar29._12_4_ = 0x80000000;
                  auVar140 = vxorps_avx512vl(auVar140,auVar29);
                  auVar140 = vminps_avx(auVar140,auVar207);
                  auVar140 = vmaxps_avx(auVar140,auVar212);
                  auVar149 = vfmadd231ps_fma(auVar216,auVar140,auVar220);
                  auVar142 = vcvttps2dq_avx512vl(auVar149);
                  auVar142 = vcvtdq2ps_avx512vl(auVar142);
                  uVar87 = vcmpps_avx512vl(auVar149,auVar142,1);
                  auVar149 = vsubps_avx512vl(auVar142,auVar224);
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar148._0_4_ = (uint)bVar113 * auVar149._0_4_ | (uint)!bVar113 * auVar142._0_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar148._4_4_ = (uint)bVar113 * auVar149._4_4_ | (uint)!bVar113 * auVar142._4_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar148._8_4_ = (uint)bVar113 * auVar149._8_4_ | (uint)!bVar113 * auVar142._8_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar148._12_4_ =
                       (uint)bVar113 * auVar149._12_4_ | (uint)!bVar113 * auVar142._12_4_;
                  auVar140 = vfmsub231ps_avx512vl(auVar140,auVar148,auVar228);
                  auVar30._8_4_ = 0x395e8083;
                  auVar30._0_8_ = 0x395e8083395e8083;
                  auVar30._12_4_ = 0x395e8083;
                  auVar149 = vfmsub231ps_avx512vl(auVar140,auVar148,auVar30);
                  auVar234._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar234._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar234._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar234._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar140 = vfmadd213ps_fma(auVar114,auVar149,auVar267);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar272);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar278);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar284);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar216);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar234,auVar149);
                  auVar235._0_4_ = auVar140._0_4_ + 1.0;
                  auVar235._4_4_ = auVar140._4_4_ + 1.0;
                  auVar235._8_4_ = auVar140._8_4_ + 1.0;
                  auVar235._12_4_ = auVar140._12_4_ + 1.0;
                  auVar140 = vcvttps2dq_avx512vl(auVar148);
                  auVar140 = vpslld_avx(auVar140,0x17);
                  auVar140 = vpaddd_avx(auVar290,auVar140);
                  auVar149 = vfmadd213ps_fma(auVar140,auVar235,auVar224);
                  auVar140 = vrcpps_avx(auVar149);
                  auVar149 = vfmsub213ps_fma(auVar149,auVar140,auVar224);
                  auVar140 = vfnmadd132ps_fma(auVar149,auVar140,auVar140);
                  break;
                case 5:
                  auVar149 = vminps_avx(auVar140,auVar207);
                  auVar149 = vmaxps_avx(auVar149,auVar212);
                  auVar142 = vfmadd213ps_fma(auVar220,auVar149,auVar216);
                  auVar141 = vcvttps2dq_avx512vl(auVar142);
                  auVar141 = vcvtdq2ps_avx512vl(auVar141);
                  uVar87 = vcmpps_avx512vl(auVar142,auVar141,1);
                  auVar142 = vsubps_avx512vl(auVar141,auVar224);
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar143._0_4_ = (uint)bVar113 * auVar142._0_4_ | (uint)!bVar113 * auVar141._0_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar143._4_4_ = (uint)bVar113 * auVar142._4_4_ | (uint)!bVar113 * auVar141._4_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar143._8_4_ = (uint)bVar113 * auVar142._8_4_ | (uint)!bVar113 * auVar141._8_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar143._12_4_ =
                       (uint)bVar113 * auVar142._12_4_ | (uint)!bVar113 * auVar141._12_4_;
                  auVar149 = vfmsub231ps_avx512vl(auVar149,auVar143,auVar228);
                  auVar149 = vfnmsub231ps_avx512vl(auVar149,auVar143,auVar296);
                  auVar255._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar255._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar255._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar255._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar142 = vfmadd213ps_avx512vl(auVar114,auVar149,auVar267);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar272);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar278);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar284);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar216);
                  auVar149 = vfmadd213ps_avx512vl(auVar142,auVar255,auVar149);
                  auVar142 = vaddps_avx512vl(auVar149,auVar224);
                  auVar149 = vcvttps2dq_avx512vl(auVar143);
                  auVar149 = vpslld_avx(auVar149,0x17);
                  auVar149 = vpaddd_avx(auVar149,auVar290);
                  auVar149 = vfmadd213ps_fma(auVar149,auVar142,auVar224);
                  uVar87 = vcmpps_avx512vl(auVar149,auVar197,2);
                  auVar26._8_4_ = 0x800000;
                  auVar26._0_8_ = 0x80000000800000;
                  auVar26._12_4_ = 0x800000;
                  auVar149 = vmaxps_avx512vl(auVar149,auVar26);
                  auVar256 = vpsrld_avx(auVar149,0x17);
                  auVar142 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar27._8_4_ = 0x3f000000;
                  auVar27._0_8_ = 0x3f0000003f000000;
                  auVar27._12_4_ = 0x3f000000;
                  auVar149 = vpternlogd_avx512vl(auVar149,auVar142,auVar27,0xea);
                  uVar92 = vcmpps_avx512vl(auVar149,auVar115,1);
                  auVar142 = vaddps_avx512vl(auVar149,auVar116);
                  auVar149 = vaddps_avx512vl(auVar142,auVar149);
                  bVar113 = (bool)((byte)uVar92 & 1);
                  auVar144._0_4_ = (uint)bVar113 * auVar149._0_4_ | (uint)!bVar113 * auVar142._0_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 1) & 1);
                  auVar144._4_4_ = (uint)bVar113 * auVar149._4_4_ | (uint)!bVar113 * auVar142._4_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 2) & 1);
                  auVar144._8_4_ = (uint)bVar113 * auVar149._8_4_ | (uint)!bVar113 * auVar142._8_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 3) & 1);
                  auVar144._12_4_ =
                       (uint)bVar113 * auVar149._12_4_ | (uint)!bVar113 * auVar142._12_4_;
                  auVar142 = vmulps_avx512vl(auVar144,auVar144);
                  auVar149 = vfmadd213ps_avx512vl(auVar117,auVar144,auVar118);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar144,auVar119);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar144,auVar120);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar144,auVar121);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar144,auVar122);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar144,auVar123);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar144,auVar137);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar144,auVar138);
                  auVar141 = vmulps_avx512vl(auVar142,auVar144);
                  auVar141 = vmulps_avx512vl(auVar141,auVar149);
                  auVar28._8_4_ = 0xffffff82;
                  auVar28._0_8_ = 0xffffff82ffffff82;
                  auVar28._12_4_ = 0xffffff82;
                  auVar149 = vpaddd_avx512vl(auVar256,auVar28);
                  auVar149 = vcvtdq2ps_avx(auVar149);
                  auVar256 = vsubps_avx512vl(auVar149,auVar224);
                  bVar113 = (bool)((byte)uVar92 & 1);
                  auVar145._0_4_ = (uint)bVar113 * auVar256._0_4_ | (uint)!bVar113 * auVar149._0_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 1) & 1);
                  auVar145._4_4_ = (uint)bVar113 * auVar256._4_4_ | (uint)!bVar113 * auVar149._4_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 2) & 1);
                  auVar145._8_4_ = (uint)bVar113 * auVar256._8_4_ | (uint)!bVar113 * auVar149._8_4_;
                  bVar113 = (bool)((byte)(uVar92 >> 3) & 1);
                  auVar145._12_4_ =
                       (uint)bVar113 * auVar256._12_4_ | (uint)!bVar113 * auVar149._12_4_;
                  auVar149 = vfmadd231ps_avx512vl(auVar141,auVar145,auVar296);
                  auVar149 = vfmsub231ps_avx512vl(auVar149,auVar216,auVar142);
                  auVar149 = vsubps_avx512vl(auVar149,auVar144);
                  auVar149 = vfnmadd231ps_fma(auVar149,auVar228,auVar145);
                  auVar142 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar146._0_4_ =
                       (uint)bVar113 * auVar142._0_4_ |
                       (uint)!bVar113 * (int)(auVar149._0_4_ + auVar149._0_4_);
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar146._4_4_ =
                       (uint)bVar113 * auVar142._4_4_ |
                       (uint)!bVar113 * (int)(auVar149._4_4_ + auVar149._4_4_);
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar146._8_4_ =
                       (uint)bVar113 * auVar142._8_4_ |
                       (uint)!bVar113 * (int)(auVar149._8_4_ + auVar149._8_4_);
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar146._12_4_ =
                       (uint)bVar113 * auVar142._12_4_ |
                       (uint)!bVar113 * (int)(auVar149._12_4_ + auVar149._12_4_);
                  auVar149 = vminps_avx(auVar146,auVar207);
                  auVar149 = vmaxps_avx(auVar149,auVar212);
                  auVar142 = vfmadd213ps_fma(auVar220,auVar149,auVar216);
                  auVar141 = vcvttps2dq_avx512vl(auVar142);
                  auVar141 = vcvtdq2ps_avx512vl(auVar141);
                  uVar87 = vcmpps_avx512vl(auVar142,auVar141,1);
                  auVar142 = vsubps_avx512vl(auVar141,auVar224);
                  bVar113 = (bool)((byte)uVar87 & 1);
                  auVar147._0_4_ = (uint)bVar113 * auVar142._0_4_ | (uint)!bVar113 * auVar141._0_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar147._4_4_ = (uint)bVar113 * auVar142._4_4_ | (uint)!bVar113 * auVar141._4_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar147._8_4_ = (uint)bVar113 * auVar142._8_4_ | (uint)!bVar113 * auVar141._8_4_;
                  bVar113 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar147._12_4_ =
                       (uint)bVar113 * auVar142._12_4_ | (uint)!bVar113 * auVar141._12_4_;
                  auVar149 = vfmsub231ps_avx512vl(auVar149,auVar147,auVar228);
                  auVar149 = vfnmsub231ps_avx512vl(auVar149,auVar147,auVar296);
                  auVar257._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar257._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar257._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar257._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar142 = vfmadd213ps_avx512vl(auVar114,auVar149,auVar267);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar272);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar278);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar284);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar216);
                  auVar149 = vfmadd213ps_avx512vl(auVar142,auVar257,auVar149);
                  auVar142 = vaddps_avx512vl(auVar149,auVar224);
                  auVar149 = vcvttps2dq_avx512vl(auVar147);
                  auVar149 = vpslld_avx(auVar149,0x17);
                  auVar149 = vpaddd_avx(auVar149,auVar290);
                  auVar142 = vfmadd213ps_fma(auVar149,auVar142,auVar224);
                  auVar149 = vrcpps_avx(auVar142);
                  auVar141 = vaddps_avx512vl(auVar149,auVar149);
                  auVar142 = vfmsub213ps_avx512vl(auVar142,auVar141,auVar139);
                  auVar149 = vfnmadd213ps_avx512vl(auVar142,auVar149,auVar141);
                  auVar140 = vfmsub231ps_fma(auVar140,auVar140,auVar149);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar236._4_4_ = uVar1;
                  auVar236._0_4_ = uVar1;
                  auVar236._8_4_ = uVar1;
                  auVar236._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar25._4_4_ = uVar1;
                  auVar25._0_4_ = uVar1;
                  auVar25._8_4_ = uVar1;
                  auVar25._12_4_ = uVar1;
                  auVar149 = vfmadd213ps_avx512vl(auVar236,auVar140,auVar25);
                  auVar149 = vmaxps_avx(auVar149,auVar197);
                  auVar149 = vminps_avx(auVar149,auVar224);
                  auVar198._0_4_ = auVar149._0_4_ * auVar140._0_4_;
                  auVar198._4_4_ = auVar149._4_4_ * auVar140._4_4_;
                  auVar198._8_4_ = auVar149._8_4_ * auVar140._8_4_;
                  auVar198._12_4_ = auVar149._12_4_ * auVar140._12_4_;
                  auVar140 = auVar198;
                }
                *pauVar93 = auVar140;
                pauVar93 = pauVar93 + 1;
                iVar86 = iVar86 + 4;
                bVar113 = iVar105 != iVar5;
                iVar105 = iVar105 + 1;
              } while (bVar113);
            }
            local_160 = local_160 + 1;
          } while (local_160 != uVar79);
        }
        if ((bVar112 && bVar110) && iVar4 == 1) {
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_158 = 0;
          auVar197 = ZEXT816(0) << 0x40;
          auVar208._8_4_ = 0x42b0c0a5;
          auVar208._0_8_ = 0x42b0c0a542b0c0a5;
          auVar208._12_4_ = 0x42b0c0a5;
          auVar213._8_4_ = 0xc2b0c0a5;
          auVar213._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar213._12_4_ = 0xc2b0c0a5;
          auVar217._8_4_ = 0x3f000000;
          auVar217._0_8_ = 0x3f0000003f000000;
          auVar217._12_4_ = 0x3f000000;
          auVar221._8_4_ = 0x3fb8aa3b;
          auVar221._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar221._12_4_ = 0x3fb8aa3b;
          auVar225._8_4_ = 0x3f800000;
          auVar225._0_8_ = 0x3f8000003f800000;
          auVar225._12_4_ = 0x3f800000;
          auVar229._8_4_ = 0x3f318000;
          auVar229._0_8_ = 0x3f3180003f318000;
          auVar229._12_4_ = 0x3f318000;
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar268._8_4_ = 0x3ab743ce;
          auVar268._0_8_ = 0x3ab743ce3ab743ce;
          auVar268._12_4_ = 0x3ab743ce;
          auVar273._8_4_ = 0x3c088908;
          auVar273._0_8_ = 0x3c0889083c088908;
          auVar273._12_4_ = 0x3c088908;
          auVar279._8_4_ = 0x3d2aa9c1;
          auVar279._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar279._12_4_ = 0x3d2aa9c1;
          auVar285._8_4_ = 0x3e2aaaaa;
          auVar285._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar285._12_4_ = 0x3e2aaaaa;
          auVar291._8_4_ = 0x3f800000;
          auVar291._0_8_ = 0x3f8000003f800000;
          auVar291._12_4_ = 0x3f800000;
          auVar297._8_4_ = 0xb95e8083;
          auVar297._0_8_ = 0xb95e8083b95e8083;
          auVar297._12_4_ = 0xb95e8083;
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
          auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
          auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
          auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar122 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar137 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          auVar138 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar139 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < iVar5) {
              pauVar93 = (undefined1 (*) [16])
                         ((long)top_blob->w * local_158 * top_blob->elemsize + (long)top_blob->data)
              ;
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar105 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar140 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar140 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x190 + (long)p_Var6) + local_158 * 0x10);
                }
                auVar200 = ZEXT1664(auVar140);
                if (0 < iVar78) {
                  pauVar108 = (undefined1 (*) [16])
                              ((this->weight_data_packed).cstep * local_158 *
                               (this->weight_data_packed).elemsize +
                              (long)(this->weight_data_packed).data);
                  p_Var9 = pp_Var8[-3];
                  iVar86 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  puVar101 = (undefined4 *)
                             ((long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar105) * 4 +
                             (long)local_e8.data);
                  uVar87 = 0;
                  do {
                    if (0 < iVar86) {
                      puVar94 = puVar101;
                      pauVar81 = pauVar108;
                      iVar99 = iVar86;
                      do {
                        uVar1 = *puVar94;
                        auVar237._4_4_ = uVar1;
                        auVar237._0_4_ = uVar1;
                        auVar237._8_4_ = uVar1;
                        auVar237._12_4_ = uVar1;
                        auVar140 = vfmadd231ps_fma(auVar200._0_16_,auVar237,*pauVar81);
                        auVar200 = ZEXT1664(auVar140);
                        pauVar81 = pauVar81 + 1;
                        puVar94 = puVar94 + *(int *)(&this->field_0xd8 + (long)p_Var9);
                        iVar99 = iVar99 + -1;
                      } while (iVar99 != 0);
                      pauVar108 = pauVar108 + (ulong)(iVar86 - 1) + 1;
                    }
                    auVar140 = auVar200._0_16_;
                    uVar87 = uVar87 + 1;
                    puVar101 = (undefined4 *)
                               ((long)puVar101 +
                               (long)local_e8.w *
                               CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize));
                  } while (uVar87 != uVar104);
                }
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar140 = vmaxps_avx(auVar140,auVar197);
                  break;
                case 2:
                  auVar149 = vmaxps_avx(auVar140,auVar197);
                  auVar140 = vminps_avx(auVar140,auVar197);
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  auVar140 = vfmadd132ps_avx512vl(auVar140,auVar149,auVar42);
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar40._4_4_ = uVar1;
                  auVar40._0_4_ = uVar1;
                  auVar40._8_4_ = uVar1;
                  auVar40._12_4_ = uVar1;
                  auVar140 = vmaxps_avx512vl(auVar140,auVar40);
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar41._4_4_ = uVar1;
                  auVar41._0_4_ = uVar1;
                  auVar41._8_4_ = uVar1;
                  auVar41._12_4_ = uVar1;
                  auVar140 = vminps_avx512vl(auVar140,auVar41);
                  break;
                case 4:
                  auVar38._8_4_ = 0x80000000;
                  auVar38._0_8_ = 0x8000000080000000;
                  auVar38._12_4_ = 0x80000000;
                  auVar140 = vxorps_avx512vl(auVar140,auVar38);
                  auVar140 = vminps_avx(auVar140,auVar208);
                  auVar140 = vmaxps_avx(auVar140,auVar213);
                  auVar149 = vfmadd231ps_fma(auVar217,auVar140,auVar221);
                  auVar142 = vcvttps2dq_avx512vl(auVar149);
                  auVar142 = vcvtdq2ps_avx512vl(auVar142);
                  uVar87 = vcmpps_avx512vl(auVar149,auVar142,1);
                  auVar149 = vsubps_avx512vl(auVar142,auVar225);
                  bVar110 = (bool)((byte)uVar87 & 1);
                  auVar155._0_4_ = (uint)bVar110 * auVar149._0_4_ | (uint)!bVar110 * auVar142._0_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar155._4_4_ = (uint)bVar110 * auVar149._4_4_ | (uint)!bVar110 * auVar142._4_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar155._8_4_ = (uint)bVar110 * auVar149._8_4_ | (uint)!bVar110 * auVar142._8_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar155._12_4_ =
                       (uint)bVar110 * auVar149._12_4_ | (uint)!bVar110 * auVar142._12_4_;
                  auVar140 = vfmsub231ps_avx512vl(auVar140,auVar155,auVar229);
                  auVar39._8_4_ = 0x395e8083;
                  auVar39._0_8_ = 0x395e8083395e8083;
                  auVar39._12_4_ = 0x395e8083;
                  auVar149 = vfmsub231ps_avx512vl(auVar140,auVar155,auVar39);
                  auVar238._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar238._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar238._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar238._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar140 = vfmadd213ps_fma(auVar114,auVar149,auVar268);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar273);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar279);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar285);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar149,auVar217);
                  auVar140 = vfmadd213ps_fma(auVar140,auVar238,auVar149);
                  auVar239._0_4_ = auVar140._0_4_ + 1.0;
                  auVar239._4_4_ = auVar140._4_4_ + 1.0;
                  auVar239._8_4_ = auVar140._8_4_ + 1.0;
                  auVar239._12_4_ = auVar140._12_4_ + 1.0;
                  auVar140 = vcvttps2dq_avx512vl(auVar155);
                  auVar140 = vpslld_avx(auVar140,0x17);
                  auVar140 = vpaddd_avx(auVar291,auVar140);
                  auVar149 = vfmadd213ps_fma(auVar140,auVar239,auVar225);
                  auVar140 = vrcpps_avx(auVar149);
                  auVar149 = vfmsub213ps_fma(auVar149,auVar140,auVar225);
                  auVar140 = vfnmadd132ps_fma(auVar149,auVar140,auVar140);
                  break;
                case 5:
                  auVar149 = vminps_avx(auVar140,auVar208);
                  auVar149 = vmaxps_avx(auVar149,auVar213);
                  auVar142 = vfmadd213ps_fma(auVar221,auVar149,auVar217);
                  auVar141 = vcvttps2dq_avx512vl(auVar142);
                  auVar141 = vcvtdq2ps_avx512vl(auVar141);
                  uVar87 = vcmpps_avx512vl(auVar142,auVar141,1);
                  auVar142 = vsubps_avx512vl(auVar141,auVar225);
                  bVar110 = (bool)((byte)uVar87 & 1);
                  auVar150._0_4_ = (uint)bVar110 * auVar142._0_4_ | (uint)!bVar110 * auVar141._0_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar150._4_4_ = (uint)bVar110 * auVar142._4_4_ | (uint)!bVar110 * auVar141._4_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar150._8_4_ = (uint)bVar110 * auVar142._8_4_ | (uint)!bVar110 * auVar141._8_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar150._12_4_ =
                       (uint)bVar110 * auVar142._12_4_ | (uint)!bVar110 * auVar141._12_4_;
                  auVar149 = vfmsub231ps_avx512vl(auVar149,auVar150,auVar229);
                  auVar149 = vfnmsub231ps_avx512vl(auVar149,auVar150,auVar297);
                  auVar258._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar258._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar258._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar258._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar142 = vfmadd213ps_avx512vl(auVar114,auVar149,auVar268);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar273);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar279);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar285);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar217);
                  auVar149 = vfmadd213ps_avx512vl(auVar142,auVar258,auVar149);
                  auVar142 = vaddps_avx512vl(auVar149,auVar225);
                  auVar149 = vcvttps2dq_avx512vl(auVar150);
                  auVar149 = vpslld_avx(auVar149,0x17);
                  auVar149 = vpaddd_avx(auVar149,auVar291);
                  auVar149 = vfmadd213ps_fma(auVar149,auVar142,auVar225);
                  uVar87 = vcmpps_avx512vl(auVar149,auVar197,2);
                  auVar35._8_4_ = 0x800000;
                  auVar35._0_8_ = 0x80000000800000;
                  auVar35._12_4_ = 0x800000;
                  auVar149 = vmaxps_avx512vl(auVar149,auVar35);
                  auVar256 = vpsrld_avx(auVar149,0x17);
                  auVar142 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar36._8_4_ = 0x3f000000;
                  auVar36._0_8_ = 0x3f0000003f000000;
                  auVar36._12_4_ = 0x3f000000;
                  auVar149 = vpternlogd_avx512vl(auVar149,auVar142,auVar36,0xea);
                  uVar92 = vcmpps_avx512vl(auVar149,auVar115,1);
                  auVar142 = vaddps_avx512vl(auVar149,auVar116);
                  auVar149 = vaddps_avx512vl(auVar142,auVar149);
                  bVar110 = (bool)((byte)uVar92 & 1);
                  auVar151._0_4_ = (uint)bVar110 * auVar149._0_4_ | (uint)!bVar110 * auVar142._0_4_;
                  bVar110 = (bool)((byte)(uVar92 >> 1) & 1);
                  auVar151._4_4_ = (uint)bVar110 * auVar149._4_4_ | (uint)!bVar110 * auVar142._4_4_;
                  bVar110 = (bool)((byte)(uVar92 >> 2) & 1);
                  auVar151._8_4_ = (uint)bVar110 * auVar149._8_4_ | (uint)!bVar110 * auVar142._8_4_;
                  bVar110 = (bool)((byte)(uVar92 >> 3) & 1);
                  auVar151._12_4_ =
                       (uint)bVar110 * auVar149._12_4_ | (uint)!bVar110 * auVar142._12_4_;
                  auVar142 = vmulps_avx512vl(auVar151,auVar151);
                  auVar149 = vfmadd213ps_avx512vl(auVar117,auVar151,auVar118);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar151,auVar119);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar151,auVar120);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar151,auVar121);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar151,auVar122);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar151,auVar123);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar151,auVar137);
                  auVar149 = vfmadd213ps_avx512vl(auVar149,auVar151,auVar138);
                  auVar141 = vmulps_avx512vl(auVar142,auVar151);
                  auVar141 = vmulps_avx512vl(auVar141,auVar149);
                  auVar37._8_4_ = 0xffffff82;
                  auVar37._0_8_ = 0xffffff82ffffff82;
                  auVar37._12_4_ = 0xffffff82;
                  auVar149 = vpaddd_avx512vl(auVar256,auVar37);
                  auVar149 = vcvtdq2ps_avx(auVar149);
                  auVar256 = vsubps_avx512vl(auVar149,auVar225);
                  bVar110 = (bool)((byte)uVar92 & 1);
                  auVar152._0_4_ = (uint)bVar110 * auVar256._0_4_ | (uint)!bVar110 * auVar149._0_4_;
                  bVar110 = (bool)((byte)(uVar92 >> 1) & 1);
                  auVar152._4_4_ = (uint)bVar110 * auVar256._4_4_ | (uint)!bVar110 * auVar149._4_4_;
                  bVar110 = (bool)((byte)(uVar92 >> 2) & 1);
                  auVar152._8_4_ = (uint)bVar110 * auVar256._8_4_ | (uint)!bVar110 * auVar149._8_4_;
                  bVar110 = (bool)((byte)(uVar92 >> 3) & 1);
                  auVar152._12_4_ =
                       (uint)bVar110 * auVar256._12_4_ | (uint)!bVar110 * auVar149._12_4_;
                  auVar149 = vfmadd231ps_avx512vl(auVar141,auVar152,auVar297);
                  auVar149 = vfmsub231ps_avx512vl(auVar149,auVar217,auVar142);
                  auVar149 = vsubps_avx512vl(auVar149,auVar151);
                  auVar149 = vfnmadd231ps_fma(auVar149,auVar229,auVar152);
                  auVar142 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar110 = (bool)((byte)uVar87 & 1);
                  auVar153._0_4_ =
                       (uint)bVar110 * auVar142._0_4_ |
                       (uint)!bVar110 * (int)(auVar149._0_4_ + auVar149._0_4_);
                  bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar153._4_4_ =
                       (uint)bVar110 * auVar142._4_4_ |
                       (uint)!bVar110 * (int)(auVar149._4_4_ + auVar149._4_4_);
                  bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar153._8_4_ =
                       (uint)bVar110 * auVar142._8_4_ |
                       (uint)!bVar110 * (int)(auVar149._8_4_ + auVar149._8_4_);
                  bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar153._12_4_ =
                       (uint)bVar110 * auVar142._12_4_ |
                       (uint)!bVar110 * (int)(auVar149._12_4_ + auVar149._12_4_);
                  auVar149 = vminps_avx(auVar153,auVar208);
                  auVar149 = vmaxps_avx(auVar149,auVar213);
                  auVar142 = vfmadd213ps_fma(auVar221,auVar149,auVar217);
                  auVar141 = vcvttps2dq_avx512vl(auVar142);
                  auVar141 = vcvtdq2ps_avx512vl(auVar141);
                  uVar87 = vcmpps_avx512vl(auVar142,auVar141,1);
                  auVar142 = vsubps_avx512vl(auVar141,auVar225);
                  bVar110 = (bool)((byte)uVar87 & 1);
                  auVar154._0_4_ = (uint)bVar110 * auVar142._0_4_ | (uint)!bVar110 * auVar141._0_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 1) & 1);
                  auVar154._4_4_ = (uint)bVar110 * auVar142._4_4_ | (uint)!bVar110 * auVar141._4_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 2) & 1);
                  auVar154._8_4_ = (uint)bVar110 * auVar142._8_4_ | (uint)!bVar110 * auVar141._8_4_;
                  bVar110 = (bool)((byte)(uVar87 >> 3) & 1);
                  auVar154._12_4_ =
                       (uint)bVar110 * auVar142._12_4_ | (uint)!bVar110 * auVar141._12_4_;
                  auVar149 = vfmsub231ps_avx512vl(auVar149,auVar154,auVar229);
                  auVar149 = vfnmsub231ps_avx512vl(auVar149,auVar154,auVar297);
                  auVar259._0_4_ = auVar149._0_4_ * auVar149._0_4_;
                  auVar259._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                  auVar259._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                  auVar259._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                  auVar142 = vfmadd213ps_avx512vl(auVar114,auVar149,auVar268);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar273);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar279);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar285);
                  auVar142 = vfmadd213ps_avx512vl(auVar142,auVar149,auVar217);
                  auVar149 = vfmadd213ps_avx512vl(auVar142,auVar259,auVar149);
                  auVar142 = vaddps_avx512vl(auVar149,auVar225);
                  auVar149 = vcvttps2dq_avx512vl(auVar154);
                  auVar149 = vpslld_avx(auVar149,0x17);
                  auVar149 = vpaddd_avx(auVar149,auVar291);
                  auVar142 = vfmadd213ps_fma(auVar149,auVar142,auVar225);
                  auVar149 = vrcpps_avx(auVar142);
                  auVar141 = vaddps_avx512vl(auVar149,auVar149);
                  auVar142 = vfmsub213ps_avx512vl(auVar142,auVar141,auVar139);
                  auVar149 = vfnmadd213ps_avx512vl(auVar142,auVar149,auVar141);
                  auVar140 = vfmsub231ps_fma(auVar140,auVar140,auVar149);
                  break;
                case 6:
                  uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                  auVar240._4_4_ = uVar1;
                  auVar240._0_4_ = uVar1;
                  auVar240._8_4_ = uVar1;
                  auVar240._12_4_ = uVar1;
                  uVar1 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar149 = vfmadd213ps_avx512vl(auVar240,auVar140,auVar34);
                  auVar149 = vmaxps_avx(auVar149,auVar197);
                  auVar149 = vminps_avx(auVar149,auVar225);
                  auVar199._0_4_ = auVar149._0_4_ * auVar140._0_4_;
                  auVar199._4_4_ = auVar149._4_4_ * auVar140._4_4_;
                  auVar199._8_4_ = auVar149._8_4_ * auVar140._8_4_;
                  auVar199._12_4_ = auVar149._12_4_ * auVar140._12_4_;
                  auVar140 = auVar199;
                }
                *pauVar93 = auVar140;
                pauVar93 = pauVar93 + 1;
                bVar110 = iVar105 != iVar5;
                iVar105 = iVar105 + 1;
              } while (bVar110);
            }
            local_158 = local_158 + 1;
          } while (local_158 != uVar79);
        }
        if (iVar4 == 4 && (bVar109 && bVar111)) {
          local_88 = (long)top_blob->w * top_blob->elemsize;
          local_90 = top_blob->data;
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_98 = (this->weight_data_packed).data;
          local_a0 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
          local_80 = (ulong)uVar79;
          local_138 = 0;
          do {
            pvVar77 = local_90;
            pvVar11 = local_e8.data;
            if (-1 < iVar5) {
              lVar82 = local_88 * local_138;
              pfVar83 = (float *)(local_a0 * local_138 + (long)local_98);
              lVar84 = (long)local_e8.w;
              lVar90 = CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize);
              pp_Var8 = this->_vptr_Convolution1D_x86_avx512;
              iVar105 = 0;
              uVar87 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar200 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                              local_138 * 4));
                }
                auVar114 = auVar200._0_16_;
                if (0 < iVar78) {
                  p_Var9 = pp_Var8[-3];
                  iVar86 = *(int *)(&this->field_0xd4 + (long)p_Var9);
                  pfVar103 = (float *)((long)pvVar11 +
                                      (long)(*(int *)(&this->field_0xdc + (long)p_Var9) * iVar105) *
                                      4);
                  uVar92 = 0;
                  pfVar98 = pfVar83;
                  do {
                    if (0 < iVar86) {
                      pfVar89 = pfVar103;
                      pfVar97 = pfVar98;
                      iVar99 = iVar86;
                      do {
                        auVar119._0_4_ = *pfVar97 * *pfVar89;
                        auVar119._4_4_ = pfVar97[1] * pfVar89[1];
                        auVar119._8_4_ = pfVar97[2] * pfVar89[2];
                        auVar119._12_4_ = pfVar97[3] * pfVar89[3];
                        auVar114 = vshufpd_avx(auVar119,auVar119,1);
                        auVar120._0_4_ = auVar114._0_4_ + auVar119._0_4_;
                        auVar120._4_4_ = auVar114._4_4_ + auVar119._4_4_;
                        auVar120._8_4_ = auVar114._8_4_ + auVar119._8_4_;
                        auVar120._12_4_ = auVar114._12_4_ + auVar119._12_4_;
                        auVar114 = vmovshdup_avx(auVar120);
                        auVar200 = ZEXT464((uint)(auVar114._0_4_ + auVar200._0_4_ + auVar120._0_4_))
                        ;
                        pfVar97 = pfVar97 + 4;
                        pfVar89 = pfVar89 + (*(int *)(&this->field_0xd8 + (long)p_Var9) << 2);
                        iVar99 = iVar99 + -1;
                      } while (iVar99 != 0);
                      pfVar98 = pfVar98 + (ulong)(iVar86 - 1) * 4 + 4;
                    }
                    auVar114 = auVar200._0_16_;
                    uVar92 = uVar92 + 1;
                    pfVar103 = (float *)((long)pfVar103 + lVar84 * lVar90);
                  } while (uVar92 != uVar104);
                }
                fVar195 = auVar114._0_4_;
                fVar196 = fVar195;
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar114 = vmaxss_avx(auVar114,ZEXT416(0));
                  fVar196 = auVar114._0_4_;
                  break;
                case 2:
                  uVar12 = vcmpss_avx512f(auVar114,ZEXT416(0),0xe);
                  bVar110 = (bool)((byte)uVar12 & 1);
                  fVar196 = (float)((uint)bVar110 * 0x3f800000 +
                                   (uint)!bVar110 * **(int **)(&this->field_0xf8 + (long)p_Var6)) *
                            fVar195;
                  break;
                case 3:
                  fVar195 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar114 = vmaxss_avx(auVar114,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                    (long)p_Var6)));
                  fVar196 = auVar114._0_4_;
                  if (fVar195 < auVar114._0_4_) {
                    fVar196 = fVar195;
                  }
                  break;
                case 4:
                  auVar114 = vminss_avx(auVar114,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar122._8_4_ = 0x80000000;
                  auVar122._0_8_ = 0x8000000080000000;
                  auVar122._12_4_ = 0x80000000;
                  auVar115 = vxorps_avx512vl(auVar114,auVar122);
                  uVar12 = vcmpss_avx512f(auVar114,ZEXT416(0xc2b0c0a5),1);
                  bVar110 = (bool)((byte)uVar12 & 1);
                  fVar196 = expf((float)((uint)bVar110 * 0x42b0c0a5 +
                                        (uint)!bVar110 * auVar115._0_4_));
                  fVar196 = 1.0 / (fVar196 + 1.0);
                  break;
                case 5:
                  fVar196 = expf(fVar195);
                  fVar196 = logf(fVar196 + 1.0);
                  fVar196 = tanhf(fVar196);
                  fVar196 = fVar196 * fVar195;
                  break;
                case 6:
                  fVar3 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                  auVar121._8_4_ = 0x80000000;
                  auVar121._0_8_ = 0x8000000080000000;
                  auVar121._12_4_ = 0x80000000;
                  auVar116 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var6))[1]);
                  auVar115 = vxorps_avx512vl(auVar116,auVar121);
                  fVar211 = auVar115._0_4_ / fVar3;
                  fVar196 = 0.0;
                  if ((fVar211 <= fVar195) && (fVar196 = fVar195, fVar195 <= fVar211 + 1.0 / fVar3))
                  {
                    auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar114,auVar116);
                    fVar196 = auVar114._0_4_ * fVar195;
                  }
                }
                *(float *)((long)pvVar77 + uVar87 * 4 + lVar82) = fVar196;
                uVar87 = uVar87 + 1;
                iVar105 = iVar105 + 4;
              } while (uVar87 != _w);
            }
            local_138 = local_138 + 1;
          } while (local_138 != local_80);
        }
        if ((bVar109 && bVar111) && iVar4 == 1) {
          iVar4 = top_blob->w;
          sVar10 = top_blob->elemsize;
          pvVar11 = top_blob->data;
          pp_Var7 = this->_vptr_Convolution1D_x86_avx512;
          local_158 = 0;
          do {
            pvVar77 = local_e8.data;
            if (-1 < iVar5) {
              lVar82 = (long)local_e8.w;
              lVar90 = CONCAT44(local_e8.elemsize._4_4_,(uint)local_e8.elemsize);
              uVar87 = 0;
              do {
                p_Var6 = pp_Var7[-3];
                if (*(int *)(&this->field_0xec + (long)p_Var6) == 0) {
                  auVar200 = ZEXT1664(ZEXT816(0) << 0x40);
                }
                else {
                  auVar200 = ZEXT464(*(uint *)(*(long *)(&this->field_0x190 + (long)p_Var6) +
                                              local_158 * 4));
                }
                auVar114 = auVar200._0_16_;
                if (0 < iVar78) {
                  iVar105 = *(int *)(&this->field_0xd4 + (long)p_Var6);
                  lVar84 = (long)((int)local_158 * iVar78 * iVar105) * 4 +
                           *(long *)(&this->field_0x148 + (long)p_Var6);
                  puVar100 = (uint *)((long)pvVar77 +
                                     (long)(*(int *)(&this->field_0xdc + (long)p_Var6) * (int)uVar87
                                           ) * 4);
                  uVar92 = 0;
                  do {
                    if (0 < iVar105) {
                      lVar106 = 0;
                      puVar95 = puVar100;
                      do {
                        auVar114 = vfmadd231ss_fma(auVar200._0_16_,
                                                   ZEXT416(*(uint *)(lVar84 + lVar106 * 4)),
                                                   ZEXT416(*puVar95));
                        auVar200 = ZEXT1664(auVar114);
                        lVar106 = lVar106 + 1;
                        puVar95 = puVar95 + *(int *)(&this->field_0xd8 + (long)p_Var6);
                      } while (iVar105 != (int)lVar106);
                      lVar84 = lVar84 + 4 + (ulong)(iVar105 - 1) * 4;
                    }
                    auVar114 = auVar200._0_16_;
                    uVar92 = uVar92 + 1;
                    puVar100 = (uint *)((long)puVar100 + lVar82 * lVar90);
                  } while (uVar92 != uVar104);
                }
                fVar195 = auVar114._0_4_;
                fVar196 = fVar195;
                switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var6)) {
                case 1:
                  auVar114 = vmaxss_avx(auVar114,ZEXT416(0));
                  fVar196 = auVar114._0_4_;
                  break;
                case 2:
                  uVar12 = vcmpss_avx512f(auVar114,ZEXT416(0),0xe);
                  bVar111 = (bool)((byte)uVar12 & 1);
                  fVar196 = (float)((uint)bVar111 * 0x3f800000 +
                                   (uint)!bVar111 * **(int **)(&this->field_0xf8 + (long)p_Var6)) *
                            fVar195;
                  break;
                case 3:
                  fVar195 = (float)(*(uint **)(&this->field_0xf8 + (long)p_Var6))[1];
                  auVar114 = vmaxss_avx(auVar114,ZEXT416(**(uint **)(&this->field_0xf8 +
                                                                    (long)p_Var6)));
                  fVar196 = auVar114._0_4_;
                  if (fVar195 < auVar114._0_4_) {
                    fVar196 = fVar195;
                  }
                  break;
                case 4:
                  auVar114 = vminss_avx(auVar114,SUB6416(ZEXT464(0x42b0c0a5),0));
                  auVar137._8_4_ = 0x80000000;
                  auVar137._0_8_ = 0x8000000080000000;
                  auVar137._12_4_ = 0x80000000;
                  auVar115 = vxorps_avx512vl(auVar114,auVar137);
                  uVar12 = vcmpss_avx512f(auVar114,ZEXT416(0xc2b0c0a5),1);
                  bVar111 = (bool)((byte)uVar12 & 1);
                  fVar196 = expf((float)((uint)bVar111 * 0x42b0c0a5 +
                                        (uint)!bVar111 * auVar115._0_4_));
                  fVar196 = 1.0 / (fVar196 + 1.0);
                  break;
                case 5:
                  fVar196 = expf(fVar195);
                  fVar196 = logf(fVar196 + 1.0);
                  fVar196 = tanhf(fVar196);
                  fVar196 = fVar196 * fVar195;
                  break;
                case 6:
                  fVar3 = **(float **)(&this->field_0xf8 + (long)p_Var6);
                  auVar123._8_4_ = 0x80000000;
                  auVar123._0_8_ = 0x8000000080000000;
                  auVar123._12_4_ = 0x80000000;
                  auVar116 = ZEXT416((uint)(*(float **)(&this->field_0xf8 + (long)p_Var6))[1]);
                  auVar115 = vxorps_avx512vl(auVar116,auVar123);
                  fVar211 = auVar115._0_4_ / fVar3;
                  fVar196 = 0.0;
                  if ((fVar211 <= fVar195) && (fVar196 = fVar195, fVar195 <= fVar211 + 1.0 / fVar3))
                  {
                    auVar114 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar114,auVar116);
                    fVar196 = auVar114._0_4_ * fVar195;
                  }
                }
                *(float *)((long)pvVar11 + uVar87 * 4 + (long)iVar4 * sVar10 * local_158) = fVar196;
                uVar87 = uVar87 + 1;
              } while (uVar87 != _w);
            }
            local_158 = local_158 + 1;
          } while (local_158 != uVar79);
        }
        iVar86 = 0;
      }
    }
    piVar76 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar76 != (int *)0x0) {
      LOCK();
      *piVar76 = *piVar76 + -1;
      UNLOCK();
      if (*piVar76 == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          if (local_e8.data != (void *)0x0) {
            free(local_e8.data);
          }
        }
        else {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar86;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}